

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

void __thiscall Spaghetti<TTA>::FirstScan(Spaghetti<TTA> *this)

{
  char cVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  ulong local_d0;
  ulong local_c8;
  int local_b0;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar39 = *(uint *)&pMVar2->field_0x8;
  uVar28 = *(uint *)&pMVar2->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar39 & 0xfffffffe;
  this->o_rows = (uVar39 & 0x80000001) == 1;
  this->e_cols = uVar28 & 0xfffffffe;
  this->o_cols = (uVar28 & 0x80000001) == 1;
  puVar4 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar7 = TTA::tail_;
  puVar5 = TTA::next_;
  TTA::length_ = 1;
  lVar10 = *(long *)&pMVar2->field_0x10;
  if (uVar39 == 1) {
    lVar31 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar46 = (long)(int)uVar28 + -2;
    uVar39 = 0;
    iVar18 = (int)lVar46;
    if (2 < (int)uVar28) {
      uVar28 = 0xfffffffe;
      uVar39 = 0;
LAB_0017b0fb:
      if (*(char *)(lVar10 + (int)uVar39) == '\0') goto LAB_0017b142;
      cVar1 = *(char *)(lVar10 + 3 + (long)(int)uVar28);
      puVar4[TTA::length_] = TTA::length_;
      puVar5[TTA::length_] = 0xffffffff;
      puVar7[TTA::length_] = TTA::length_;
      uVar28 = TTA::length_ + 1;
      *(uint *)(lVar31 + (long)(int)uVar39 * 4) = TTA::length_;
      TTA::length_ = uVar28;
      uVar28 = uVar39;
      if (cVar1 == '\0') goto LAB_0017b1dd;
      while (uVar28 = uVar39 + 2, (int)uVar28 < iVar18) {
        uVar15 = (long)(int)uVar39;
        uVar39 = uVar28;
        while (*(char *)(lVar10 + 2 + uVar15) != '\0') {
          if (*(char *)(lVar10 + 3 + uVar15) == '\0') {
            uVar16 = *(undefined4 *)(lVar31 + uVar15 * 4);
            lVar37 = uVar15 + 2;
            goto LAB_0017b1d9;
          }
          *(undefined4 *)(lVar31 + 8 + uVar15 * 4) = *(undefined4 *)(lVar31 + uVar15 * 4);
          uVar47 = uVar15 + 2;
          lVar37 = uVar15 + 4;
          uVar39 = uVar39 + 2;
          uVar15 = uVar47;
          if (lVar46 <= lVar37) goto LAB_0017b629;
        }
LAB_0017b142:
        lVar37 = (long)(int)uVar39;
        if (*(char *)(lVar10 + 1 + lVar37) == '\0') goto LAB_0017b1c1;
        puVar4[TTA::length_] = TTA::length_;
        puVar5[TTA::length_] = 0xffffffff;
        puVar7[TTA::length_] = TTA::length_;
        uVar28 = TTA::length_ + 1;
        *(uint *)(lVar31 + lVar37 * 4) = TTA::length_;
        TTA::length_ = uVar28;
      }
      uVar47 = (ulong)uVar39;
      uVar39 = uVar28;
LAB_0017b629:
      lVar46 = (long)(int)uVar39;
      if (iVar18 < (int)uVar39) {
        if (*(char *)(lVar10 + lVar46) == '\0') goto LAB_0017b69d;
      }
      else if (*(char *)(lVar10 + lVar46) == '\0') goto LAB_0017b652;
      *(undefined4 *)(lVar31 + lVar46 * 4) = *(undefined4 *)(lVar31 + (long)(int)uVar47 * 4);
      return;
    }
LAB_0017b1ed:
    lVar46 = (long)(int)uVar39;
    cVar1 = *(char *)(lVar10 + lVar46);
    if ((int)uVar39 <= iVar18) {
      if (cVar1 != '\0') goto LAB_0017b65c;
LAB_0017b652:
      lVar46 = (long)(int)uVar39;
      cVar1 = *(char *)(lVar10 + 1 + lVar46);
    }
    if (cVar1 == '\0') {
LAB_0017b69d:
      *(undefined4 *)(lVar31 + lVar46 * 4) = 0;
      return;
    }
LAB_0017b65c:
    puVar4[TTA::length_] = TTA::length_;
    TTA::next_[TTA::length_] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar39 = TTA::length_ + 1;
    *(uint *)(lVar31 + lVar46 * 4) = TTA::length_;
    TTA::length_ = uVar39;
    return;
  }
  lVar37 = **(long **)&pMVar2->field_0x48;
  lVar46 = lVar10 + lVar37;
  lVar48 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar31 = (long)(int)uVar28 + -2;
  uVar15 = 0;
  local_b0 = (int)lVar31;
  if (2 < (int)uVar28) {
    uVar15 = 0;
    do {
      if (*(char *)(lVar10 + (int)uVar15) != '\0') goto LAB_0017b458;
      if (*(char *)(lVar46 + (int)uVar15) != '\0') goto LAB_0017b458;
LAB_0017b299:
      iVar18 = (int)uVar15;
      uVar47 = (ulong)iVar18;
      if ((*(char *)(uVar47 + 1 + lVar10) != '\0') || (*(char *)(lVar46 + 1 + uVar47) != '\0')) {
        puVar4[TTA::length_] = TTA::length_;
        puVar5[TTA::length_] = 0xffffffff;
        puVar7[TTA::length_] = TTA::length_;
        uVar29 = TTA::length_;
        TTA::length_ = TTA::length_ + 1;
LAB_0017b2e4:
        *(uint *)(lVar48 + uVar47 * 4) = uVar29;
LAB_0017b305:
        lVar30 = (long)(int)uVar15;
        uVar15 = lVar30 + 2;
        if ((int)uVar15 < local_b0) {
          if ((*(char *)(lVar10 + uVar15) != '\0') || (*(char *)(lVar46 + uVar15) != '\0')) {
LAB_0017b329:
            lVar30 = (long)(int)uVar15;
            cVar1 = *(char *)(lVar10 + 1 + lVar30);
            *(undefined4 *)(lVar48 + lVar30 * 4) = *(undefined4 *)(lVar48 + -8 + lVar30 * 4);
            if (cVar1 == '\0') {
              do {
                puVar8 = TTA::tail_;
                puVar6 = TTA::next_;
                iVar18 = (int)uVar15;
                uVar29 = iVar18 + 2;
                if (local_b0 <= (int)uVar29) {
LAB_0017b52d:
                  uVar15 = (ulong)uVar29;
                  lVar31 = (long)(int)uVar29;
                  if (local_b0 < (int)uVar29) {
                    if ((*(char *)(lVar10 + lVar31) == '\0') && (*(char *)(lVar46 + lVar31) == '\0')
                       ) goto LAB_0017f402;
                  }
                  else {
                    if (*(char *)(lVar10 + lVar31) != '\0') {
                      if (*(char *)(lVar46 + 1 + (long)iVar18) != '\0') goto LAB_0017b6b5;
                      goto LAB_0017b587;
                    }
                    if (*(char *)(lVar46 + lVar31) == '\0') goto LAB_0017b6c3;
                  }
                  if (*(char *)(lVar46 + 1 + (long)iVar18) == '\0') goto LAB_0017b6d9;
                  *(undefined4 *)(lVar48 + lVar31 * 4) = *(undefined4 *)(lVar48 + (long)iVar18 * 4);
                  goto LAB_0017b716;
                }
                lVar26 = (long)iVar18;
                lVar30 = lVar26 + 2;
                lVar22 = lVar48 + lVar26 * 4;
                lVar44 = lVar10 + 2 + lVar37 + lVar26;
                lVar49 = lVar10 + 2 + lVar26;
                lVar26 = lVar26 << 0x20;
                lVar42 = 0;
                while (*(char *)(lVar49 + lVar42) == '\0') {
                  if (*(char *)(lVar44 + lVar42) == '\0') {
                    uVar15 = (ulong)(uint)((int)lVar30 + (int)lVar42);
                    goto LAB_0017b299;
                  }
                  if (*(char *)(lVar49 + 1 + lVar42) != '\0') {
                    uVar47 = lVar30 + lVar42;
                    if (*(char *)(lVar42 + -1 + lVar44) == '\0') {
                      puVar4[TTA::length_] = TTA::length_;
                      puVar5[TTA::length_] = 0xffffffff;
                      puVar7[TTA::length_] = TTA::length_;
                      uVar29 = TTA::length_;
                      TTA::length_ = TTA::length_ + 1;
                    }
                    else {
                      uVar29 = *(uint *)(lVar22 + lVar42 * 4);
                    }
                    uVar15 = uVar47 & 0xffffffff;
                    goto LAB_0017b2e4;
                  }
                  if (*(char *)(lVar44 + -1 + lVar42) == '\0') {
                    puVar4[TTA::length_] = TTA::length_;
                    puVar6[TTA::length_] = 0xffffffff;
                    puVar8[TTA::length_] = TTA::length_;
                    uVar29 = TTA::length_;
                    TTA::length_ = TTA::length_ + 1;
                  }
                  else {
                    uVar29 = *(uint *)(lVar22 + lVar42 * 4);
                  }
                  *(uint *)(lVar22 + 8 + lVar42 * 4) = uVar29;
                  lVar26 = lVar26 + 0x200000000;
                  lVar11 = lVar30 + lVar42;
                  lVar42 = lVar42 + 2;
                  if (lVar31 <= lVar11 + 2) {
                    uVar29 = iVar18 + (int)lVar42 + 2;
                    iVar18 = iVar18 + (int)lVar42;
                    goto LAB_0017b52d;
                  }
                }
                if (*(char *)(lVar46 + 1 + (lVar26 >> 0x20)) != '\0') goto code_r0x0017b421;
                uVar15 = lVar30 + lVar42 & 0xffffffff;
LAB_0017b458:
                cVar1 = *(char *)(lVar10 + 1 + (long)(int)uVar15);
                puVar4[TTA::length_] = TTA::length_;
                puVar5[TTA::length_] = 0xffffffff;
                puVar7[TTA::length_] = TTA::length_;
                uVar29 = TTA::length_ + 1;
                *(uint *)(lVar48 + (long)(int)uVar15 * 4) = TTA::length_;
                TTA::length_ = uVar29;
                if (cVar1 != '\0') break;
              } while( true );
            }
            goto LAB_0017b305;
          }
          goto LAB_0017b299;
        }
        if (local_b0 < (int)uVar15) {
          if ((*(char *)(lVar10 + uVar15) == '\0') && (*(char *)(lVar46 + uVar15) == '\0')) {
            *(undefined4 *)(lVar48 + 8 + lVar30 * 4) = 0;
          }
          else {
            *(undefined4 *)(lVar48 + 8 + lVar30 * 4) = *(undefined4 *)(lVar48 + lVar30 * 4);
          }
        }
        else {
          if ((*(char *)(lVar10 + uVar15) == '\0') && (*(char *)(lVar46 + uVar15) == '\0'))
          goto LAB_0017b6c3;
LAB_0017b6b5:
          *(undefined4 *)(lVar48 + (long)(int)uVar15 * 4) =
               *(undefined4 *)(lVar48 + -8 + (long)(int)uVar15 * 4);
        }
        goto LAB_0017b716;
      }
      *(undefined4 *)(lVar48 + (long)iVar18 * 4) = 0;
      uVar15 = (ulong)(iVar18 + 2U);
    } while ((int)(iVar18 + 2U) < local_b0);
  }
  uVar29 = (uint)uVar15;
  lVar31 = (long)(int)uVar29;
  if (local_b0 < (int)uVar29) {
    if (*(char *)(lVar10 + lVar31) == '\0') {
      cVar1 = *(char *)(lVar46 + lVar31);
joined_r0x0017b6d3:
      if (cVar1 == '\0') {
LAB_0017f402:
        *(undefined4 *)(lVar48 + lVar31 * 4) = 0;
        goto LAB_0017b716;
      }
    }
LAB_0017b6d9:
    puVar4[TTA::length_] = TTA::length_;
    TTA::next_[TTA::length_] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar29 = TTA::length_ + 1;
    *(uint *)(lVar48 + lVar31 * 4) = TTA::length_;
    TTA::length_ = uVar29;
  }
  else {
    if ((*(char *)(lVar10 + lVar31) == '\0') && (*(char *)(lVar46 + lVar31) == '\0')) {
LAB_0017b6c3:
      lVar31 = (long)(int)uVar15;
      if (*(char *)(lVar31 + 1 + lVar10) == '\0') {
        cVar1 = *(char *)(lVar46 + 1 + lVar31);
        goto joined_r0x0017b6d3;
      }
      goto LAB_0017b6d9;
    }
LAB_0017b587:
    puVar4[TTA::length_] = TTA::length_;
    TTA::next_[TTA::length_] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar9 = TTA::length_ + 1;
    *(uint *)(lVar48 + (long)(int)uVar29 * 4) = TTA::length_;
    TTA::length_ = uVar9;
  }
LAB_0017b716:
  if (2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
    lVar10 = (long)local_b0;
    lVar31 = 2;
    lVar37 = 1;
    lVar46 = 3;
    lVar48 = 0;
    do {
      pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar44 = *(long *)&pMVar2->field_0x10;
      lVar49 = **(long **)&pMVar2->field_0x48;
      lVar38 = lVar49 * lVar31;
      lVar30 = lVar44 + lVar38;
      lVar32 = lVar30 - lVar49;
      lVar22 = lVar30 + lVar49;
      lVar26 = *(long *)&pMVar3->field_0x10;
      lVar42 = **(long **)&pMVar3->field_0x48;
      lVar11 = lVar42 * lVar31;
      lVar33 = lVar26 + lVar11;
      lVar34 = lVar33 + lVar42 * -2;
      cVar1 = *(char *)(lVar44 + lVar38);
      if (2 < (int)uVar28) {
        lVar23 = lVar32 - lVar49;
        local_d0 = 0;
        uVar15 = 0;
        if (cVar1 == '\0') goto LAB_0017b8de;
LAB_0017b802:
        iVar18 = (int)local_d0;
        lVar24 = (long)iVar18;
        if (*(char *)(lVar24 + 1 + lVar32) == '\0') {
          if (*(char *)(lVar30 + 1 + lVar24) != '\0') goto LAB_0017b928;
          if (*(char *)(lVar32 + lVar24) == '\0') {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar29 = TTA::length_ + 1;
            *(uint *)(lVar33 + lVar24 * 4) = TTA::length_;
            TTA::length_ = uVar29;
            goto LAB_0017bf47;
          }
          *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + lVar24 * 4);
          goto LAB_0017c768;
        }
        *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + lVar24 * 4);
LAB_0017df04:
        do {
          iVar18 = (int)local_d0;
          uVar29 = iVar18 + 2;
          if (local_b0 <= (int)uVar29) {
LAB_0017e050:
            uVar47 = (ulong)uVar29;
            if ((int)uVar29 <= local_b0) {
              if (*(char *)(lVar30 + uVar47) == '\0') {
                local_d0 = uVar47;
                if (*(char *)(lVar22 + uVar47) == '\0') {
LAB_0017e3b2:
                  local_d0 = local_d0 & 0xffffffff;
                  goto LAB_0017bd70;
                }
                if (*(char *)(lVar30 + (ulong)(iVar18 + 3)) == '\0') goto LAB_0017e1e5;
                if (*(char *)(lVar30 + (ulong)(iVar18 + 1)) != '\0') goto LAB_0017e17b;
                uVar15 = uVar47;
                if (*(char *)(lVar22 + (ulong)(iVar18 + 1)) == '\0') goto LAB_0017b7ca;
                if (*(char *)(lVar32 + (ulong)(iVar18 + 3)) == '\0') {
                  if (*(char *)(lVar32 + uVar47) == '\0') goto LAB_0017e1f9;
                  goto LAB_0017b845;
                }
LAB_0017e185:
                uVar15 = (ulong)(int)uVar29;
                if (*(char *)(lVar32 + uVar15) == '\0') {
                  uVar9 = *(uint *)(lVar34 + uVar15 * 4);
                  if (*(char *)(lVar23 + uVar15) == '\0') {
LAB_0017c492:
                    uVar29 = *(uint *)(lVar33 + -8 + uVar15 * 4);
LAB_0017c49b:
                    uVar29 = TTA::Merge(uVar9,uVar29);
                    *(uint *)(lVar33 + uVar15 * 4) = uVar29;
                  }
                  else {
                    *(uint *)(lVar33 + uVar15 * 4) = uVar9;
                  }
                  goto LAB_0017e1a6;
                }
LAB_0017e18e:
                uVar29 = *(uint *)(lVar34 + uVar15 * 4);
              }
              else {
                if ((*(char *)(lVar30 + (ulong)(iVar18 + 1)) != '\0') ||
                   (*(char *)(lVar22 + (ulong)(iVar18 + 1)) != '\0')) {
LAB_0017e17b:
                  uVar47 = (ulong)(int)uVar29;
                  if (*(char *)(lVar32 + 1 + uVar47) != '\0') goto LAB_0017e185;
LAB_0017e19b:
                  uVar16 = *(undefined4 *)(lVar33 + -8 + uVar47 * 4);
                  goto LAB_0017e1a3;
                }
                if (*(char *)(lVar32 + 3 + (long)iVar18) == '\0') goto LAB_0017e3ba;
                if (*(char *)(lVar32 + uVar47) != '\0') goto LAB_0017b845;
LAB_0017e0cc:
                uVar15 = (ulong)(int)uVar29;
                if (*(char *)(lVar23 + uVar15) != '\0') goto LAB_0017e18e;
                uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + uVar15 * 4),
                                    *(uint *)(lVar34 + uVar15 * 4));
              }
LAB_0017e196:
              *(uint *)(lVar33 + uVar15 * 4) = uVar29;
              goto LAB_0017e1a6;
            }
            if (*(char *)(lVar30 + uVar47) == '\0') {
              if (*(char *)(lVar22 + uVar47) == '\0') goto LAB_0017e141;
LAB_0017e1e5:
              if ((*(char *)(lVar22 + (ulong)(iVar18 + 1)) == '\0') &&
                 (*(char *)(lVar30 + (ulong)(iVar18 + 1)) == '\0')) goto LAB_0017d80d;
            }
            else if ((*(char *)(lVar30 + (ulong)(iVar18 + 1)) == '\0') &&
                    (*(char *)(lVar22 + (ulong)(iVar18 + 1)) == '\0')) {
LAB_0017e3ba:
              if (*(char *)(lVar32 + uVar47) != '\0') goto LAB_0017b845;
              uVar16 = *(undefined4 *)(lVar34 + (long)iVar18 * 4);
              goto LAB_0017e1a3;
            }
LAB_0017e1f9:
            lVar44 = (long)iVar18;
LAB_0017e1fc:
            uVar16 = *(undefined4 *)(lVar33 + lVar44 * 4);
            goto LAB_0017e1a3;
          }
          lVar19 = (long)iVar18;
          lVar24 = lVar19 + 2;
          lVar40 = lVar49 * lVar46 + lVar19;
          lVar35 = lVar49 * lVar37 + lVar19;
          lVar36 = lVar11 + lVar19 * 4;
          lVar13 = lVar42 * lVar48 + lVar19 * 4;
          lVar20 = lVar19 << 0x20;
          lVar25 = lVar44 + lVar38 + lVar19;
          lVar12 = lVar44 + 2 + lVar35;
          lVar27 = lVar26 + lVar36 + 8;
          lVar41 = lVar26 + lVar13 + 8;
          lVar14 = 0;
          while( true ) {
            lVar43 = lVar20 >> 0x1e;
            lVar21 = lVar20 >> 0x20;
            if (*(char *)(lVar25 + 2 + lVar14) == '\0') goto LAB_0017e205;
            iVar45 = (int)lVar24;
            if ((*(char *)(lVar25 + 1 + lVar14) != '\0') ||
               (*(char *)(lVar44 + lVar40 + 1 + lVar14) != '\0')) {
              local_d0 = (ulong)(uint)(iVar45 + (int)lVar14);
              goto LAB_0017d5ff;
            }
            if (*(char *)(lVar12 + 1 + lVar14) == '\0') {
              local_d0 = lVar24 + lVar14;
              iVar18 = (int)local_d0;
              if (*(char *)(lVar14 + 3 + lVar38 + lVar19 + lVar44) == '\0') {
                if (*(char *)(lVar14 + 2 + lVar35 + lVar44) == '\0') {
                  *(undefined4 *)(lVar36 + lVar26 + 8 + lVar14 * 4) =
                       *(undefined4 *)(lVar34 + lVar43);
                  goto LAB_0017bf47;
                }
                *(undefined4 *)(lVar27 + lVar14 * 4) = *(undefined4 *)(lVar41 + lVar14 * 4);
                goto LAB_0017c768;
              }
              cVar1 = *(char *)(lVar14 + 2 + lVar35 + lVar44);
              if (*(char *)(lVar32 + 4 + lVar21) != '\0') {
                uVar15 = local_d0;
                if (cVar1 == '\0') goto LAB_0017e599;
                goto LAB_0017b94a;
              }
              if (cVar1 != '\0') {
                *(undefined4 *)(lVar27 + lVar14 * 4) =
                     *(undefined4 *)(lVar13 + lVar26 + 8 + lVar14 * 4);
                goto LAB_0017e4bf;
              }
              *(undefined4 *)(lVar27 + lVar14 * 4) = *(undefined4 *)(lVar34 + lVar21 * 4);
              goto LAB_0017e685;
            }
            if (*(char *)(lVar12 + lVar14) == '\0') break;
            *(undefined4 *)(lVar27 + lVar14 * 4) = *(undefined4 *)(lVar41 + lVar14 * 4);
            lVar20 = lVar20 + 0x200000000;
            lVar43 = lVar24 + lVar14;
            lVar14 = lVar14 + 2;
            if (lVar10 <= lVar43 + 2) {
              iVar18 = iVar18 + (int)lVar14;
              uVar29 = iVar45 + (int)lVar14;
              goto LAB_0017e050;
            }
          }
          local_d0 = (ulong)(uint)(iVar45 + (int)lVar14);
LAB_0017e347:
          lVar24 = (long)(int)local_d0;
          if (*(char *)(lVar23 + lVar24) == '\0') {
            uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + lVar24 * 4),*(uint *)(lVar34 + lVar24 * 4));
          }
          else {
            uVar29 = *(uint *)(lVar34 + lVar24 * 4);
          }
          *(uint *)(lVar33 + lVar24 * 4) = uVar29;
        } while( true );
      }
      if (uVar28 == 2) {
        local_d0 = 0;
        uVar15 = local_d0;
        if (cVar1 == '\0') {
LAB_0017bd54:
          uVar47 = (ulong)(int)local_d0;
          if (*(char *)(lVar22 + uVar47) == '\0') {
            local_d0 = local_d0 & 0xffffffff;
LAB_0017bd70:
            uVar29 = (uint)local_d0;
            uVar15 = local_d0 & 0xffffffff;
            if (*(char *)(lVar30 + 1 + (long)(int)uVar29) != '\0') goto LAB_0017b7ca;
LAB_0017bd81:
            uVar47 = (ulong)(int)uVar29;
            if (*(char *)(lVar22 + 1 + uVar47) == '\0') goto LAB_0017e141;
          }
          else {
            uVar15 = local_d0;
            if (*(char *)(lVar30 + 1 + uVar47) != '\0') goto LAB_0017b7ca;
          }
LAB_0017d80d:
          TTA::rtable_[TTA::length_] = TTA::length_;
          TTA::next_[TTA::length_] = 0xffffffff;
          TTA::tail_[TTA::length_] = TTA::length_;
          uVar29 = TTA::length_ + 1;
          *(uint *)(lVar33 + uVar47 * 4) = TTA::length_;
          TTA::length_ = uVar29;
        }
        else {
LAB_0017b7ca:
          uVar47 = (ulong)(int)uVar15;
          local_d0 = uVar15 & 0xffffffff;
          if (*(char *)(lVar32 + 1 + uVar47) == '\0') goto LAB_0017b838;
LAB_0017b845:
          uVar16 = *(undefined4 *)(lVar34 + uVar47 * 4);
LAB_0017e1a3:
          *(undefined4 *)(lVar33 + uVar47 * 4) = uVar16;
        }
      }
      else {
        local_d0 = 0;
        uVar15 = 0;
        if (cVar1 != '\0') {
LAB_0017b838:
          uVar47 = (ulong)(int)local_d0;
          cVar1 = *(char *)(lVar32 + uVar47);
joined_r0x0017d12c:
          if (cVar1 == '\0') goto LAB_0017d80d;
          goto LAB_0017b845;
        }
LAB_0017bd03:
        uVar47 = (ulong)(int)uVar15;
        if (*(char *)(lVar22 + uVar47) != '\0') goto LAB_0017d80d;
LAB_0017e141:
        *(undefined4 *)(lVar33 + uVar47 * 4) = 0;
      }
LAB_0017e1a6:
      lVar31 = lVar31 + 2;
      lVar37 = lVar37 + 2;
      lVar48 = lVar48 + 2;
      lVar46 = lVar46 + 2;
    } while ((int)lVar31 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
  }
  if (this->o_rows == false) {
    return;
  }
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar46 = *(long *)&pMVar2->field_0x10;
  lVar37 = **(long **)&pMVar2->field_0x48;
  lVar22 = (long)(int)(uVar39 - 1);
  lVar10 = lVar46 + lVar37 * lVar22;
  lVar49 = lVar10 - lVar37;
  lVar48 = *(long *)&pMVar3->field_0x10;
  lVar30 = **(long **)&pMVar3->field_0x48;
  lVar31 = lVar48 + lVar30 * lVar22;
  lVar44 = lVar31 + lVar30 * -2;
  uVar15 = 0;
  if (2 < (int)uVar28) {
    lVar33 = lVar49 - lVar37;
    lVar34 = (long)local_b0;
    lVar11 = lVar30 * lVar22 + lVar48 + 8;
    lVar32 = (lVar22 + -1) * lVar37;
    lVar38 = lVar32 + lVar46 + 4;
    lVar42 = lVar37 * lVar22 + lVar46 + 3;
    lVar26 = lVar37 * (lVar22 + -2) + lVar46 + 3;
    lVar37 = lVar30 * (lVar22 + -2) + lVar48 + 0x10;
    iVar18 = -2;
    uVar15 = 0;
    do {
      lVar48 = (long)(int)uVar15;
      uVar47 = uVar15;
      if (*(char *)(lVar10 + lVar48) == '\0') goto LAB_0017e925;
      if (*(char *)((long)iVar18 + 3 + lVar49) != '\0') {
        *(undefined4 *)(lVar31 + lVar48 * 4) = *(undefined4 *)(lVar44 + lVar48 * 4);
        goto LAB_0017f137;
      }
      if (*(char *)(lVar10 + 3 + (long)iVar18) != '\0') {
LAB_0017e93f:
        uVar15 = (ulong)(int)uVar47;
        if (*(char *)(lVar49 + 2 + uVar15) != '\0') {
          if (*(char *)(lVar49 + uVar15) != '\0') goto LAB_0017e956;
          goto LAB_0017ecd0;
        }
        if (*(char *)(lVar49 + uVar15) == '\0') goto LAB_0017ecdb;
LAB_0017e97e:
        *(undefined4 *)(lVar31 + uVar15 * 4) = *(undefined4 *)(lVar44 + uVar15 * 4);
        lVar48 = (long)(int)uVar47;
        uVar15 = lVar48 + 2;
        uVar39 = (uint)uVar15;
        if ((int)uVar39 < local_b0) {
          uVar47 = uVar15;
          if (*(char *)(lVar10 + uVar15) == '\0') goto LAB_0017ec85;
          if (*(char *)(lVar48 + 3 + lVar49) != '\0') {
            if (*(char *)(lVar33 + uVar15) == '\0') {
              uVar39 = TTA::Merge(*(uint *)(lVar44 + 8 + lVar48 * 4),*(uint *)(lVar31 + lVar48 * 4))
              ;
              *(uint *)(lVar31 + 8 + lVar48 * 4) = uVar39;
              goto LAB_0017f137;
            }
LAB_0017efe2:
            lVar48 = (long)(int)uVar15;
            cVar1 = *(char *)(lVar33 + -1 + lVar48);
            goto joined_r0x0017eff2;
          }
          if (*(char *)(lVar10 + 3 + lVar48) != '\0') {
            if (*(char *)(lVar48 + 4 + lVar49) == '\0') {
              *(undefined4 *)(lVar31 + 8 + lVar48 * 4) = *(undefined4 *)(lVar31 + lVar48 * 4);
              goto LAB_0017ef13;
            }
            if ((*(char *)(lVar33 + 3 + lVar48) == '\0') || (*(char *)(lVar33 + uVar15) == '\0')) {
              uVar39 = TTA::Merge(*(uint *)(lVar44 + 0x10 + lVar48 * 4),
                                  *(uint *)(lVar31 + lVar48 * 4));
              *(uint *)(lVar31 + 8 + lVar48 * 4) = uVar39;
              goto LAB_0017ed1f;
            }
LAB_0017f064:
            lVar48 = (long)(int)uVar15;
            uVar47 = uVar15;
            if (*(char *)(lVar33 + -1 + lVar48) != '\0') goto LAB_0017e96c;
            uVar39 = *(uint *)(lVar44 + 8 + lVar48 * 4);
            uVar28 = *(uint *)(lVar31 + -8 + lVar48 * 4);
LAB_0017ea3d:
            uVar39 = TTA::Merge(uVar39,uVar28);
            do {
              *(uint *)(lVar31 + lVar48 * 4) = uVar39;
              uVar15 = uVar47;
LAB_0017ed1f:
              iVar18 = (int)uVar15;
              uVar39 = iVar18 + 2;
              if (local_b0 <= (int)uVar39) {
LAB_0017f4d9:
                if (local_b0 < (int)uVar39) {
                  uVar15 = (ulong)uVar39;
                  goto LAB_0017f4e1;
                }
                lVar46 = (long)(int)uVar39;
                lVar37 = (long)iVar18;
                if (*(char *)(lVar10 + lVar46) == '\0') {
                  if (*(char *)(lVar10 + 3 + lVar37) == '\0') goto LAB_0017f6e2;
                  goto LAB_0017f6d4;
                }
                if (*(char *)(lVar49 + 3 + lVar37) != '\0') goto LAB_0017f6d4;
LAB_0017f54b:
                uVar16 = *(undefined4 *)(lVar31 + lVar37 * 4);
                goto LAB_0017f6d9;
              }
              lVar23 = (long)iVar18;
              lVar24 = lVar23 << 0x20;
              lVar48 = lVar11 + lVar23 * 4;
              lVar30 = lVar38 + lVar23;
              lVar22 = lVar37 + lVar23 * 4;
              lVar36 = 0;
LAB_0017ed71:
              if (*(char *)(lVar42 + lVar23 + -1 + lVar36) != '\0') {
                iVar45 = (int)lVar36;
                if (*(char *)(lVar30 + -1 + lVar36) != '\0') {
                  uVar15 = (ulong)(iVar18 + iVar45 + 2);
                  *(undefined4 *)(lVar48 + lVar36 * 4) = *(undefined4 *)(lVar22 + -8 + lVar36 * 4);
                  goto LAB_0017f137;
                }
                if (*(char *)(lVar42 + lVar23 + lVar36) != '\0') goto code_r0x0017ed95;
                uVar39 = iVar18 + iVar45 + 2;
                *(undefined4 *)(lVar48 + lVar36 * 4) = *(undefined4 *)(lVar31 + (lVar24 >> 0x1e));
LAB_0017f013:
                uVar15 = (ulong)uVar39;
                goto LAB_0017f3a5;
              }
              uVar47 = (uVar15 & 0xffffffff) + lVar36 + 2;
              iVar18 = (int)uVar47;
              lVar48 = lVar24 + 0x300000000 >> 0x20;
              uVar15 = lVar23 + 2 + lVar36;
              if (*(char *)(lVar10 + lVar48) == '\0') goto LAB_0017ea7e;
              if (*(char *)(lVar49 + lVar48) != '\0') {
LAB_0017ec9b:
                do {
                  *(undefined4 *)(lVar31 + uVar15 * 4) = *(undefined4 *)(lVar44 + uVar15 * 4);
                  uVar15 = (long)(int)uVar47 + 2;
                  if (local_b0 <= (int)uVar15) {
                    if (local_b0 < (int)uVar15) goto LAB_0017f4e1;
                    if (*(char *)(lVar10 + uVar15) == '\0') goto LAB_0017f6b5;
LAB_0017f50f:
                    lVar46 = (long)(int)uVar15;
                    if (*(char *)(lVar49 + 1 + lVar46) == '\0') {
                      uVar39 = *(uint *)(lVar31 + -8 + lVar46 * 4);
                      goto LAB_0017f78f;
                    }
                    if (*(char *)(lVar49 + lVar46) != '\0') goto LAB_0017f529;
                    uVar39 = *(uint *)(lVar44 + lVar46 * 4);
                    if (*(char *)(lVar33 + lVar46) != '\0') {
                      *(uint *)(lVar31 + lVar46 * 4) = uVar39;
                      return;
                    }
                    uVar28 = *(uint *)(lVar31 + -8 + lVar46 * 4);
                    goto LAB_0017f78a;
                  }
                  uVar47 = uVar15;
                  if (*(char *)(lVar10 + uVar15) != '\0') goto LAB_0017f1ca;
LAB_0017e925:
                  iVar18 = (int)uVar47;
                  uVar15 = (ulong)iVar18;
                  if (*(char *)(uVar15 + 1 + lVar10) == '\0') {
                    while( true ) {
                      uVar15 = (ulong)iVar18;
LAB_0017ea7e:
                      *(undefined4 *)(lVar31 + uVar15 * 4) = 0;
                      lVar48 = (long)iVar18;
                      uVar15 = lVar48 + 2;
                      if (local_b0 <= (int)uVar15) break;
                      uVar47 = uVar15;
                      if (*(char *)(lVar10 + uVar15) == '\0') goto LAB_0017e925;
                      if (*(char *)(lVar48 + 3 + lVar49) != '\0') {
                        if ((*(char *)(lVar49 + uVar15) == '\0') &&
                           (*(char *)(lVar49 + 1 + lVar48) != '\0')) goto LAB_0017f28a;
                        *(undefined4 *)(lVar31 + 8 + lVar48 * 4) =
                             *(undefined4 *)(lVar44 + 8 + lVar48 * 4);
                        goto LAB_0017f137;
                      }
                      if (*(char *)(lVar10 + 3 + lVar48) == '\0') {
                        if (*(char *)(lVar49 + uVar15) == '\0') {
                          if (*(char *)(lVar49 + 1 + lVar48) == '\0') {
                            TTA::rtable_[TTA::length_] = TTA::length_;
                            TTA::next_[TTA::length_] = 0xffffffff;
                            TTA::tail_[TTA::length_] = TTA::length_;
                            uVar39 = TTA::length_ + 1;
                            *(uint *)(lVar31 + 8 + lVar48 * 4) = TTA::length_;
                            TTA::length_ = uVar39;
                            goto LAB_0017f3a5;
                          }
                          uVar16 = *(undefined4 *)(lVar44 + lVar48 * 4);
                        }
                        else {
                          uVar16 = *(undefined4 *)(lVar44 + 8 + lVar48 * 4);
                        }
                        *(undefined4 *)(lVar31 + 8 + lVar48 * 4) = uVar16;
                        goto LAB_0017f3a5;
                      }
                      cVar1 = *(char *)(lVar48 + 2 + lVar49);
                      if (*(char *)(lVar48 + 4 + lVar49) != '\0') {
                        if (cVar1 != '\0') goto LAB_0017e956;
                        if (*(char *)(lVar49 + 1 + lVar48) == '\0') {
                          *(undefined4 *)(lVar31 + 8 + lVar48 * 4) =
                               *(undefined4 *)(lVar44 + 0x10 + lVar48 * 4);
                        }
                        else {
LAB_0017f258:
                          lVar48 = (long)(int)uVar15;
                          if ((*(char *)(lVar33 + 1 + lVar48) == '\0') ||
                             (*(char *)(lVar33 + lVar48) == '\0')) {
                            uVar39 = TTA::Merge(*(uint *)(lVar44 + -8 + lVar48 * 4),
                                                *(uint *)(lVar44 + 8 + lVar48 * 4));
                          }
                          else {
                            uVar39 = *(uint *)(lVar44 + 8 + lVar48 * 4);
                          }
                          *(uint *)(lVar31 + lVar48 * 4) = uVar39;
                        }
                        goto LAB_0017ed1f;
                      }
                      if (cVar1 != '\0') goto LAB_0017e97e;
                      if (*(char *)(lVar49 + 1 + lVar48) == '\0') {
                        TTA::rtable_[TTA::length_] = TTA::length_;
                        TTA::next_[TTA::length_] = 0xffffffff;
                        TTA::tail_[TTA::length_] = TTA::length_;
                        uVar39 = TTA::length_;
                        TTA::length_ = TTA::length_ + 1;
                      }
                      else {
                        uVar39 = *(uint *)(lVar44 + lVar48 * 4);
                      }
LAB_0017ebd3:
                      *(uint *)(lVar31 + uVar15 * 4) = uVar39;
                      lVar48 = (long)(int)uVar47;
                      uVar15 = lVar48 + 2;
                      if (local_b0 <= (int)uVar15) {
                        if (local_b0 < (int)uVar15) goto LAB_0017f4e1;
                        if (*(char *)(lVar10 + uVar15) == '\0') goto LAB_0017f557;
                        if (*(char *)(lVar49 + 3 + lVar48) != '\0') goto LAB_0017f5d5;
                        goto LAB_0017f76b;
                      }
                      uVar47 = uVar15;
                      if (*(char *)(lVar10 + uVar15) != '\0') {
                        if (*(char *)(lVar48 + 3 + lVar49) != '\0') {
                          uVar39 = TTA::Merge(*(uint *)(lVar44 + 8 + lVar48 * 4),
                                              *(uint *)(lVar31 + lVar48 * 4));
                          *(uint *)(lVar31 + 8 + lVar48 * 4) = uVar39;
                          goto LAB_0017f137;
                        }
                        if (*(char *)(lVar10 + 3 + lVar48) == '\0') {
                          *(undefined4 *)(lVar31 + 8 + lVar48 * 4) =
                               *(undefined4 *)(lVar31 + lVar48 * 4);
                          goto LAB_0017f3a5;
                        }
                        if (*(char *)(lVar48 + 4 + lVar49) != '\0') {
                          uVar39 = TTA::Merge(*(uint *)(lVar44 + 0x10 + lVar48 * 4),
                                              *(uint *)(lVar31 + lVar48 * 4));
                          *(uint *)(lVar31 + 8 + lVar48 * 4) = uVar39;
                          goto LAB_0017ed1f;
                        }
                        *(undefined4 *)(lVar31 + 8 + lVar48 * 4) =
                             *(undefined4 *)(lVar31 + lVar48 * 4);
LAB_0017ef13:
                        while( true ) {
                          iVar18 = (int)uVar15;
                          uVar39 = iVar18 + 2;
                          if (local_b0 <= (int)uVar39) break;
                          lVar24 = (long)iVar18;
                          lVar48 = lVar24 + 2;
                          lVar23 = lVar24 << 0x20;
                          lVar30 = lVar11 + lVar24 * 4;
                          lVar22 = lVar38 + lVar24;
                          lVar36 = 0;
                          while( true ) {
                            if (*(char *)(lVar42 + lVar24 + -1 + lVar36) == '\0') {
                              uVar47 = (ulong)(uint)((int)lVar48 + (int)lVar36);
                              goto LAB_0017ec85;
                            }
                            lVar13 = lVar23 >> 0x20;
                            lVar12 = lVar23 >> 0x1e;
                            if (*(char *)(lVar22 + -1 + lVar36) != '\0') break;
                            if (*(char *)(lVar42 + lVar24 + lVar36) == '\0') {
                              uVar39 = (int)lVar48 + (int)lVar36;
                              *(undefined4 *)(lVar30 + lVar36 * 4) =
                                   *(undefined4 *)(lVar31 + lVar12);
                              goto LAB_0017f013;
                            }
                            if (*(char *)(lVar22 + lVar36) != '\0') {
                              if ((*(char *)(lVar36 + lVar26 + lVar24) == '\0') ||
                                 (*(char *)(lVar36 + -1 + lVar26 + lVar24) == '\0')) {
                                uVar39 = *(uint *)(lVar37 + lVar24 * 4 + lVar36 * 4);
                                uVar28 = *(uint *)(lVar31 + lVar12);
                              }
                              else {
                                if (*(char *)(lVar49 + lVar13) != '\0') {
                                  uVar15 = lVar48 + lVar36 & 0xffffffff;
                                  goto LAB_0017f064;
                                }
                                uVar39 = *(uint *)(lVar37 + lVar24 * 4 + lVar36 * 4);
                                uVar28 = *(uint *)(lVar31 + lVar13 * 4);
                              }
                              uVar39 = TTA::Merge(uVar39,uVar28);
                              *(uint *)(lVar30 + lVar36 * 4) = uVar39;
                              uVar15 = lVar48 + lVar36 & 0xffffffff;
                              goto LAB_0017ed1f;
                            }
                            *(undefined4 *)(lVar30 + lVar36 * 4) =
                                 *(undefined4 *)(lVar30 + -8 + lVar36 * 4);
                            lVar23 = lVar23 + 0x200000000;
                            lVar13 = lVar36 + lVar48;
                            lVar36 = lVar36 + 2;
                            if (lVar34 <= lVar13 + 2) {
                              uVar39 = iVar18 + (int)lVar36 + 2;
                              iVar18 = iVar18 + (int)lVar36;
                              goto LAB_0017f41a;
                            }
                          }
                          if (*(char *)(lVar36 + -1 + lVar26 + lVar24) == '\0') {
                            uVar39 = *(uint *)(lVar37 + lVar24 * 4 + -8 + lVar36 * 4);
                            uVar28 = *(uint *)(lVar31 + lVar12);
                          }
                          else {
                            if (*(char *)(lVar49 + lVar13) != '\0') {
                              uVar15 = lVar48 + lVar36 & 0xffffffff;
                              goto LAB_0017efe2;
                            }
                            uVar39 = *(uint *)(lVar37 + lVar24 * 4 + -8 + lVar36 * 4);
                            uVar28 = *(uint *)(lVar31 + lVar13 * 4);
                          }
                          uVar39 = TTA::Merge(uVar39,uVar28);
                          *(uint *)(lVar30 + lVar36 * 4) = uVar39;
                          uVar15 = lVar48 + lVar36 & 0xffffffff;
LAB_0017f137:
                          iVar18 = (int)uVar15;
                          uVar39 = iVar18 + 2;
                          if (local_b0 <= (int)uVar39) {
LAB_0017f486:
                            uVar15 = (ulong)uVar39;
                            lVar46 = (long)(int)uVar39;
                            if (local_b0 < (int)uVar39) {
                              if (*(char *)(lVar10 + lVar46) == '\0') goto LAB_0017f6e2;
                              lVar37 = (long)iVar18;
                              if (*(char *)(lVar10 + 1 + lVar37) != '\0') goto LAB_0017f54b;
                            }
                            else {
                              if (*(char *)(lVar10 + lVar46) == '\0') goto LAB_0017f6b5;
                              if (*(char *)(lVar10 + 1 + (long)iVar18) != '\0') goto LAB_0017f50f;
                              if (*(char *)(lVar49 + 3 + (long)iVar18) != '\0') {
                                if (*(char *)(lVar49 + lVar46) == '\0') goto LAB_0017f651;
                                goto LAB_0017f6d4;
                              }
                            }
                            if (*(char *)(lVar49 + lVar46) != '\0') goto LAB_0017f6d4;
                            uVar16 = *(undefined4 *)(lVar44 + (long)iVar18 * 4);
                            goto LAB_0017f6d9;
                          }
                          lVar23 = (long)iVar18;
                          lVar48 = lVar23 + 2;
                          lVar30 = lVar37 + lVar23 * 4;
                          lVar22 = lVar46 + lVar32 + 2 + lVar23;
                          lVar36 = lVar42 + lVar23;
                          lVar23 = lVar11 + lVar23 * 4;
                          lVar24 = 0;
LAB_0017f172:
                          iVar45 = (int)lVar48;
                          iVar17 = (int)lVar24;
                          if (*(char *)(lVar36 + -1 + lVar24) == '\0') {
                            uVar47 = (ulong)(uint)(iVar45 + iVar17);
                            goto LAB_0017e925;
                          }
                          if (*(char *)(lVar36 + -2 + lVar24) == '\0') {
                            if (*(char *)(lVar22 + 1 + lVar24) == '\0') {
                              uVar15 = lVar48 + lVar24;
                              if (*(char *)(lVar24 + lVar36) != '\0') {
                                if (*(char *)(lVar24 + 2 + lVar22) != '\0') {
                                  uVar15 = uVar15 & 0xffffffff;
                                  uVar47 = uVar15;
                                  if (*(char *)(lVar24 + lVar22) == '\0') goto LAB_0017f258;
                                  goto LAB_0017e956;
                                }
                                if (*(char *)(lVar24 + lVar22) == '\0') {
                                  uVar47 = uVar15 & 0xffffffff;
                                  uVar39 = *(uint *)(lVar30 + -0x10 + lVar24 * 4);
                                  goto LAB_0017ebd3;
                                }
                                uVar47 = uVar15 & 0xffffffff;
                                goto LAB_0017e97e;
                              }
                              if (*(char *)(lVar24 + lVar22) == '\0') {
                                uVar16 = *(undefined4 *)(lVar30 + -0x10 + lVar24 * 4);
                              }
                              else {
                                uVar16 = *(undefined4 *)(lVar30 + -8 + lVar24 * 4);
                              }
                              *(undefined4 *)(lVar23 + lVar24 * 4) = uVar16;
                              uVar15 = uVar15 & 0xffffffff;
                              goto LAB_0017f3a5;
                            }
                            if (*(char *)(lVar22 + lVar24) != '\0') goto code_r0x0017f197;
                            uVar15 = (ulong)(uint)(iVar45 + iVar17);
LAB_0017f28a:
                            lVar48 = (long)(int)uVar15;
                            cVar1 = *(char *)(lVar33 + lVar48);
joined_r0x0017eff2:
                            if (cVar1 == '\0') {
                              uVar39 = TTA::Merge(*(uint *)(lVar44 + -8 + lVar48 * 4),
                                                  *(uint *)(lVar44 + lVar48 * 4));
                            }
                            else {
                              uVar39 = *(uint *)(lVar44 + lVar48 * 4);
                            }
                            *(uint *)(lVar31 + lVar48 * 4) = uVar39;
                            goto LAB_0017f137;
                          }
                          uVar15 = (ulong)(uint)(iVar45 + iVar17);
LAB_0017f1ca:
                          lVar48 = (long)(int)uVar15;
                          if (*(char *)(lVar48 + 1 + lVar49) != '\0') {
                            if (*(char *)(lVar49 + lVar48) == '\0') {
                              uVar39 = *(uint *)(lVar44 + lVar48 * 4);
                              if (*(char *)(lVar33 + lVar48) != '\0') {
                                *(uint *)(lVar31 + lVar48 * 4) = uVar39;
                                goto LAB_0017f137;
                              }
                              uVar39 = TTA::Merge(uVar39,*(uint *)(lVar31 + -8 + lVar48 * 4));
                            }
                            else {
                              uVar39 = *(uint *)(lVar44 + lVar48 * 4);
                            }
                            *(uint *)(lVar31 + lVar48 * 4) = uVar39;
                            goto LAB_0017f137;
                          }
                          if (*(char *)(lVar10 + 1 + lVar48) == '\0') {
                            *(undefined4 *)(lVar31 + lVar48 * 4) =
                                 *(undefined4 *)(lVar31 + -8 + lVar48 * 4);
                            goto LAB_0017f3a5;
                          }
                          if (*(char *)(lVar48 + 2 + lVar49) != '\0') {
                            if (*(char *)(lVar33 + 1 + lVar48) == '\0') {
                              uVar39 = *(uint *)(lVar44 + 8 + lVar48 * 4);
LAB_0017f34c:
                              uVar39 = TTA::Merge(uVar39,*(uint *)(lVar31 + -8 + lVar48 * 4));
                            }
                            else {
                              if (*(char *)(lVar49 + lVar48) == '\0') {
                                uVar39 = *(uint *)(lVar44 + 8 + lVar48 * 4);
                                if (*(char *)(lVar33 + lVar48) == '\0') goto LAB_0017f34c;
                                *(uint *)(lVar31 + lVar48 * 4) = uVar39;
                                goto LAB_0017ed1f;
                              }
                              uVar39 = *(uint *)(lVar44 + 8 + lVar48 * 4);
                            }
                            *(uint *)(lVar31 + lVar48 * 4) = uVar39;
                            goto LAB_0017ed1f;
                          }
                          *(undefined4 *)(lVar31 + lVar48 * 4) =
                               *(undefined4 *)(lVar31 + -8 + lVar48 * 4);
                        }
LAB_0017f41a:
                        uVar15 = (ulong)uVar39;
                        if (local_b0 < (int)uVar39) goto LAB_0017f4e1;
                        lVar46 = (long)(int)uVar39;
                        if (*(char *)(lVar10 + lVar46) == '\0') goto LAB_0017f557;
                        lVar10 = (long)iVar18;
                        if (*(char *)(lVar49 + 3 + lVar10) == '\0') {
                          uVar39 = *(uint *)(lVar31 + lVar10 * 4);
                          goto LAB_0017f78f;
                        }
                        if ((*(char *)(lVar33 + lVar46) != '\0') &&
                           (*(char *)(lVar49 + lVar10) != '\0')) goto LAB_0017f46a;
                        uVar39 = *(uint *)(lVar44 + lVar46 * 4);
                        uVar28 = *(uint *)(lVar31 + lVar10 * 4);
                        goto LAB_0017f78a;
                      }
LAB_0017ec85:
                      iVar18 = (int)uVar47;
                      uVar15 = (ulong)iVar18;
                      if (*(char *)(uVar15 + 1 + lVar10) != '\0') {
                        if (*(char *)(lVar49 + 1 + uVar15) != '\0') goto LAB_0017ec9b;
                        uVar15 = (ulong)iVar18;
                        if (*(char *)(uVar15 + 2 + lVar49) != '\0') goto LAB_0017ecd0;
LAB_0017ecdb:
                        TTA::rtable_[TTA::length_] = TTA::length_;
                        TTA::next_[TTA::length_] = 0xffffffff;
                        TTA::tail_[TTA::length_] = TTA::length_;
                        uVar39 = TTA::length_;
                        TTA::length_ = TTA::length_ + 1;
                        goto LAB_0017ebd3;
                      }
                    }
                    if (local_b0 < (int)uVar15) {
                      if (*(char *)(lVar10 + uVar15) == '\0') {
                        *(undefined4 *)(lVar31 + 8 + lVar48 * 4) = 0;
                        return;
                      }
LAB_0017f742:
                      if (*(char *)(lVar49 + uVar15) == '\0') {
                        if (*(char *)(lVar49 + 1 + lVar48) == '\0') {
                          TTA::rtable_[TTA::length_] = TTA::length_;
                          TTA::next_[TTA::length_] = 0xffffffff;
                          TTA::tail_[TTA::length_] = TTA::length_;
                          uVar39 = TTA::length_ + 1;
                          *(uint *)(lVar31 + 8 + lVar48 * 4) = TTA::length_;
                          TTA::length_ = uVar39;
                          return;
                        }
                        uVar16 = *(undefined4 *)(lVar44 + lVar48 * 4);
                        goto LAB_0017f74e;
                      }
                    }
                    else {
                      if (*(char *)(lVar10 + uVar15) == '\0') goto LAB_0017f6b5;
                      if (*(char *)(lVar49 + 3 + lVar48) == '\0') goto LAB_0017f742;
                      if ((*(char *)(lVar49 + uVar15) == '\0') &&
                         (*(char *)(lVar49 + 1 + lVar48) != '\0')) {
LAB_0017f651:
                        lVar46 = (long)(int)uVar15;
                        cVar1 = *(char *)(lVar33 + lVar46);
                        goto joined_r0x0017f65d;
                      }
                    }
                    uVar16 = *(undefined4 *)(lVar44 + 8 + lVar48 * 4);
LAB_0017f74e:
                    *(undefined4 *)(lVar31 + 8 + lVar48 * 4) = uVar16;
                    return;
                  }
                } while (*(char *)(lVar49 + 1 + uVar15) != '\0');
                goto LAB_0017e93f;
              }
              if (*(char *)(lVar49 + 4 + (lVar24 >> 0x20)) == '\0') goto LAB_0017e97e;
LAB_0017e956:
              lVar48 = (long)(int)uVar47;
              if (*(char *)(lVar33 + 1 + lVar48) == '\0') goto LAB_0017ea33;
LAB_0017e96c:
              uVar39 = *(uint *)(lVar44 + 8 + lVar48 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar31 + 8 + lVar48 * 4) = *(undefined4 *)(lVar31 + lVar48 * 4);
          goto LAB_0017f3a5;
        }
        if ((int)uVar39 <= local_b0) {
          if (*(char *)(lVar10 + uVar15) != '\0') {
            if (*(char *)(lVar49 + 3 + lVar48) == '\0') {
LAB_0017f76b:
              uVar39 = *(uint *)(lVar31 + lVar48 * 4);
            }
            else {
              if (*(char *)(lVar33 + uVar15) != '\0') {
LAB_0017f46a:
                lVar46 = (long)(int)uVar39;
                cVar1 = *(char *)(lVar33 + -1 + lVar46);
joined_r0x0017f65d:
                if (cVar1 == '\0') {
                  uVar39 = *(uint *)(lVar44 + -8 + lVar46 * 4);
                  uVar28 = *(uint *)(lVar44 + lVar46 * 4);
LAB_0017f78a:
                  uVar39 = TTA::Merge(uVar39,uVar28);
                }
                else {
LAB_0017f529:
                  uVar39 = *(uint *)(lVar44 + lVar46 * 4);
                }
LAB_0017f78f:
                *(uint *)(lVar31 + lVar46 * 4) = uVar39;
                return;
              }
LAB_0017f5d5:
              uVar39 = TTA::Merge(*(uint *)(lVar44 + 8 + lVar48 * 4),*(uint *)(lVar31 + lVar48 * 4))
              ;
            }
            *(uint *)(lVar31 + 8 + lVar48 * 4) = uVar39;
            return;
          }
LAB_0017f557:
          lVar46 = (long)(int)uVar15;
          if (*(char *)(lVar46 + 1 + lVar10) == '\0') goto LAB_0017f6e2;
          cVar1 = *(char *)(lVar49 + 1 + lVar46);
          goto joined_r0x0017f56b;
        }
LAB_0017f4e1:
        lVar46 = (long)(int)uVar15;
        if (*(char *)(lVar10 + lVar46) == '\0') goto LAB_0017f6e2;
        uVar16 = *(undefined4 *)(lVar31 + -8 + lVar46 * 4);
        goto LAB_0017f6d9;
      }
      if (*(char *)(lVar49 + lVar48) == '\0') {
        TTA::rtable_[TTA::length_] = TTA::length_;
        TTA::next_[TTA::length_] = 0xffffffff;
        TTA::tail_[TTA::length_] = TTA::length_;
        uVar39 = TTA::length_ + 1;
        *(uint *)(lVar31 + lVar48 * 4) = TTA::length_;
        TTA::length_ = uVar39;
      }
      else {
        *(undefined4 *)(lVar31 + lVar48 * 4) = *(undefined4 *)(lVar44 + lVar48 * 4);
      }
LAB_0017f3a5:
      iVar18 = (int)uVar15;
      uVar15 = (ulong)(iVar18 + 2U);
    } while ((int)(iVar18 + 2U) < local_b0);
  }
  iVar18 = (int)uVar15;
  lVar46 = (long)iVar18;
  if (local_b0 < iVar18) {
    if (*(char *)(lVar10 + lVar46) == '\0') {
LAB_0017f6e2:
      *(undefined4 *)(lVar31 + lVar46 * 4) = 0;
      return;
    }
  }
  else {
    if (*(char *)(lVar10 + lVar46) == '\0') {
LAB_0017f6b5:
      iVar18 = (int)uVar15;
      lVar46 = (long)iVar18;
      if (*(char *)(lVar10 + 1 + lVar46) == '\0') goto LAB_0017f6e2;
    }
    lVar46 = (long)iVar18;
    if (*(char *)(lVar49 + 1 + lVar46) != '\0') goto LAB_0017f6d4;
  }
  lVar46 = (long)iVar18;
  cVar1 = *(char *)(lVar49 + lVar46);
joined_r0x0017f56b:
  if (cVar1 == '\0') {
    TTA::rtable_[TTA::length_] = TTA::length_;
    TTA::next_[TTA::length_] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar39 = TTA::length_ + 1;
    *(uint *)(lVar31 + lVar46 * 4) = TTA::length_;
    TTA::length_ = uVar39;
    return;
  }
LAB_0017f6d4:
  uVar16 = *(undefined4 *)(lVar44 + lVar46 * 4);
LAB_0017f6d9:
  *(undefined4 *)(lVar31 + lVar46 * 4) = uVar16;
  return;
LAB_0017b1c1:
  uVar16 = 0;
LAB_0017b1d9:
  *(undefined4 *)(lVar31 + lVar37 * 4) = uVar16;
  uVar28 = uVar39;
LAB_0017b1dd:
  uVar39 = uVar28 + 2;
  if (iVar18 <= (int)uVar39) goto LAB_0017b1ed;
  goto LAB_0017b0fb;
code_r0x0017b421:
  uVar15 = lVar30 + lVar42 & 0xffffffff;
  goto LAB_0017b329;
LAB_0017e205:
  local_d0 = lVar24 + lVar14;
  if (*(char *)(lVar14 + 2 + lVar40 + lVar44) == '\0') goto LAB_0017b8fc;
  lVar12 = lVar20 + 0x300000000 >> 0x20;
  lVar19 = lVar20 + 0x100000000 >> 0x20;
  if (*(char *)(lVar30 + lVar12) == '\0') {
    if (*(char *)(lVar22 + lVar19) != '\0') {
      *(undefined4 *)(lVar36 + lVar26 + 8 + lVar14 * 4) = *(undefined4 *)(lVar33 + lVar43);
      goto LAB_0017c26d;
    }
    if (*(char *)(lVar30 + lVar19) != '\0') {
      *(undefined4 *)(lVar36 + lVar26 + 8 + lVar14 * 4) = *(undefined4 *)(lVar33 + lVar43);
      goto LAB_0017c26d;
    }
    TTA::rtable_[TTA::length_] = TTA::length_;
    TTA::next_[TTA::length_] = 0xffffffff;
    TTA::tail_[TTA::length_] = TTA::length_;
    uVar29 = TTA::length_ + 1;
    *(uint *)(lVar36 + lVar26 + 8 + lVar14 * 4) = TTA::length_;
    TTA::length_ = uVar29;
    goto LAB_0017c26d;
  }
  uVar15 = local_d0;
  if (*(char *)(lVar30 + lVar19) != '\0') goto LAB_0017e286;
  if (*(char *)(lVar22 + lVar19) == '\0') goto LAB_0017b90d;
  if (*(char *)(lVar32 + lVar12) != '\0') goto LAB_0017e297;
  if (*(char *)(lVar32 + 4 + lVar21) != '\0') goto LAB_0017d64f;
  if (*(char *)(lVar14 + 2 + lVar35 + lVar44) == '\0') {
    *(undefined4 *)(lVar27 + lVar14 * 4) = *(undefined4 *)(lVar33 + lVar21 * 4);
LAB_0017e685:
    local_d0 = lVar24 + lVar14;
    goto LAB_0017c8e4;
  }
  *(undefined4 *)(lVar27 + lVar14 * 4) = *(undefined4 *)(lVar13 + lVar26 + 8 + lVar14 * 4);
LAB_0017e4bf:
  local_d0 = lVar24 + lVar14;
LAB_0017b980:
  lVar24 = (long)(int)local_d0;
  local_d0 = lVar24 + 2;
  if ((int)local_d0 < local_b0) {
    if (*(char *)(lVar30 + local_d0) == '\0') {
      if (*(char *)(lVar22 + local_d0) == '\0') goto LAB_0017ca1d;
      if (*(char *)(lVar24 + 3 + lVar30) == '\0') {
LAB_0017cadb:
        *(undefined4 *)(lVar33 + 8 + lVar24 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_0017c26d;
      }
      if (*(char *)(lVar32 + 3 + lVar24) != '\0') {
        if (*(char *)(lVar23 + local_d0) == '\0') {
          uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4));
          *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
          goto LAB_0017d566;
        }
LAB_0017d356:
        lVar24 = (long)(int)local_d0;
        uVar29 = *(uint *)(lVar34 + lVar24 * 4);
        if (*(char *)(lVar23 + -1 + lVar24) == '\0') {
          uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
          *(uint *)(lVar33 + lVar24 * 4) = uVar29;
          goto LAB_0017d566;
        }
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
        goto LAB_0017d566;
      }
      goto LAB_0017bacb;
    }
    if (*(char *)(lVar24 + 3 + lVar32) == '\0') {
      if (*(char *)(lVar30 + 3 + lVar24) == '\0') {
        *(undefined4 *)(lVar33 + 8 + lVar24 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
LAB_0017d70a:
        lVar24 = (long)(int)local_d0;
        local_d0 = lVar24 + 2;
        if ((int)local_d0 < local_b0) {
          if (*(char *)(lVar30 + local_d0) == '\0') {
            if (*(char *)(lVar22 + local_d0) == '\0') {
LAB_0017d975:
              local_d0 = local_d0 & 0xffffffff;
LAB_0017b8fc:
              do {
                iVar18 = (int)local_d0;
                local_d0 = local_d0 & 0xffffffff;
                if (*(char *)(lVar30 + 1 + (long)iVar18) != '\0') goto LAB_0017b90d;
LAB_0017bc33:
                lVar24 = (long)iVar18;
                if (*(char *)(lVar22 + 1 + lVar24) == '\0') {
                  *(undefined4 *)(lVar33 + lVar24 * 4) = 0;
                  local_d0 = lVar24 + 2;
                  if ((int)local_d0 < local_b0) {
                    uVar15 = local_d0;
                    if (*(char *)(lVar30 + local_d0) != '\0') goto LAB_0017bdbe;
LAB_0017b8de:
                    local_d0 = uVar15;
                    lVar24 = (long)(int)local_d0;
                    if (*(char *)(lVar22 + lVar24) != '\0') {
                      if (*(char *)(lVar30 + 1 + lVar24) == '\0') goto LAB_0017c218;
                      local_d0 = local_d0 & 0xffffffff;
LAB_0017b90d:
                      lVar24 = (long)(int)local_d0;
                      if (*(char *)(lVar32 + 1 + lVar24) != '\0') {
LAB_0017b917:
                        *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + lVar24 * 4);
                        goto LAB_0017d566;
                      }
LAB_0017b928:
                      uVar15 = local_d0 & 0xffffffff;
                      lVar24 = (long)(int)local_d0;
                      local_d0 = uVar15;
                      if (*(char *)(lVar32 + 2 + lVar24) != '\0') {
                        if (*(char *)(lVar32 + lVar24) != '\0') goto LAB_0017b94a;
                        goto LAB_0017be19;
                      }
                      if (*(char *)(lVar32 + lVar24) == '\0') {
LAB_0017be7f:
                        TTA::rtable_[TTA::length_] = TTA::length_;
                        TTA::next_[TTA::length_] = 0xffffffff;
                        TTA::tail_[TTA::length_] = TTA::length_;
                        uVar29 = TTA::length_ + 1;
                        *(uint *)(lVar33 + lVar24 * 4) = TTA::length_;
                        TTA::length_ = uVar29;
LAB_0017c8e4:
                        lVar24 = (long)(int)local_d0;
                        local_d0 = lVar24 + 2;
                        if ((int)local_d0 < local_b0) {
                          if (*(char *)(lVar30 + local_d0) == '\0') {
                            if (*(char *)(lVar22 + local_d0) == '\0') goto LAB_0017ca1d;
                            if (*(char *)(lVar24 + 3 + lVar30) == '\0') goto LAB_0017cadb;
                            if (*(char *)(lVar32 + 3 + lVar24) != '\0') {
                              uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),
                                                  *(uint *)(lVar33 + lVar24 * 4));
                              *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
                              goto LAB_0017d566;
                            }
                          }
                          else {
                            if (*(char *)(lVar24 + 3 + lVar32) != '\0') {
                              uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),
                                                  *(uint *)(lVar33 + lVar24 * 4));
                              *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
                              goto LAB_0017df04;
                            }
                            if (*(char *)(lVar30 + 3 + lVar24) == '\0') {
                              *(undefined4 *)(lVar33 + 8 + lVar24 * 4) =
                                   *(undefined4 *)(lVar33 + lVar24 * 4);
                              goto LAB_0017d70a;
                            }
                          }
                          if (*(char *)(lVar24 + 4 + lVar32) != '\0') {
                            uVar29 = TTA::Merge(*(uint *)(lVar34 + 0x10 + lVar24 * 4),
                                                *(uint *)(lVar33 + lVar24 * 4));
                            *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
                            local_d0 = local_d0 & 0xffffffff;
                            goto LAB_0017cb8f;
                          }
                          *(undefined4 *)(lVar33 + 8 + lVar24 * 4) =
                               *(undefined4 *)(lVar33 + lVar24 * 4);
                          local_d0 = local_d0 & 0xffffffff;
LAB_0017cf74:
                          iVar18 = (int)local_d0;
                          uVar29 = iVar18 + 2;
                          if ((int)uVar29 < local_b0) {
                            lVar12 = (long)iVar18;
                            lVar24 = lVar12 + 2;
                            lVar13 = lVar12 << 0x20;
                            lVar36 = lVar11 + lVar12 * 4;
                            lVar14 = lVar26 + lVar36 + 8;
                            lVar19 = lVar38 + lVar12 + lVar44;
                            lVar20 = lVar19 + 3;
                            lVar25 = lVar49 * lVar37 + lVar12 + lVar44;
                            lVar27 = 0;
                            while( true ) {
                              lVar35 = lVar13 >> 0x20;
                              lVar40 = lVar13 >> 0x1e;
                              iVar17 = (int)lVar27;
                              iVar45 = (int)lVar24;
                              if (*(char *)(lVar19 + 2 + lVar27) == '\0') break;
                              if (*(char *)(lVar25 + 3 + lVar27) != '\0') {
                                local_d0 = lVar24 + lVar27;
                                if (*(char *)(lVar27 + 2 + lVar49 * lVar48 + lVar12 + lVar44) ==
                                    '\0') {
                                  uVar29 = TTA::Merge(*(uint *)(lVar42 * lVar48 + lVar12 * 4 +
                                                                lVar26 + 8 + lVar27 * 4),
                                                      *(uint *)(lVar33 + lVar40));
                                  *(uint *)(lVar14 + lVar27 * 4) = uVar29;
                                }
                                else {
                                  if (*(char *)(lVar32 + lVar35) != '\0') goto LAB_0017b9bf;
                                  uVar29 = TTA::Merge(*(uint *)(lVar42 * lVar48 + lVar12 * 4 +
                                                                lVar26 + 8 + lVar27 * 4),
                                                      *(uint *)(lVar33 + lVar35 * 4));
                                  *(uint *)(lVar14 + lVar27 * 4) = uVar29;
                                }
                                goto LAB_0017df04;
                              }
                              if (*(char *)(lVar20 + lVar27) == '\0') {
                                local_d0 = (ulong)(uint)(iVar45 + iVar17);
                                *(undefined4 *)(lVar36 + lVar26 + 8 + lVar27 * 4) =
                                     *(undefined4 *)(lVar33 + lVar40);
                                goto LAB_0017d70a;
                              }
LAB_0017d04f:
                              if (*(char *)(lVar25 + 4 + lVar27) != '\0') goto LAB_0017d137;
                              *(undefined4 *)(lVar14 + lVar27 * 4) =
                                   *(undefined4 *)(lVar26 + lVar36 + lVar27 * 4);
                              lVar13 = lVar13 + 0x200000000;
                              lVar35 = lVar24 + lVar27;
                              lVar27 = lVar27 + 2;
                              if (lVar10 <= lVar35 + 2) {
                                iVar18 = iVar18 + (int)lVar27;
                                uVar29 = iVar45 + (int)lVar27;
                                goto LAB_0017d0bd;
                              }
                            }
                            if (*(char *)(lVar49 * lVar46 + lVar12 + lVar44 + 2 + lVar27) != '\0') {
                              if (*(char *)(lVar20 + lVar27) == '\0') {
                                *(undefined4 *)(lVar36 + lVar26 + 8 + lVar27 * 4) =
                                     *(undefined4 *)(lVar33 + lVar40);
                                local_d0 = (ulong)(uint)(iVar45 + iVar17);
                                goto LAB_0017c26d;
                              }
                              if (*(char *)(lVar25 + 3 + lVar27) == '\0') goto LAB_0017d04f;
                              local_d0 = lVar24 + lVar27;
                              if (*(char *)(lVar27 + 2 + lVar49 * lVar48 + lVar12 + lVar44) == '\0')
                              {
                                uVar29 = TTA::Merge(*(uint *)(lVar42 * lVar48 + lVar12 * 4 + lVar26
                                                              + 8 + lVar27 * 4),
                                                    *(uint *)(lVar33 + lVar40));
                                *(uint *)(lVar14 + lVar27 * 4) = uVar29;
                                goto LAB_0017d566;
                              }
                              if (*(char *)(lVar32 + lVar35) == '\0') {
                                uVar29 = TTA::Merge(*(uint *)(lVar42 * lVar48 + lVar12 * 4 + lVar26
                                                              + 8 + lVar27 * 4),
                                                    *(uint *)(lVar33 + lVar35 * 4));
                                *(uint *)(lVar14 + lVar27 * 4) = uVar29;
                                goto LAB_0017d566;
                              }
                              goto LAB_0017d356;
                            }
                            local_d0 = (ulong)(uint)(iVar45 + iVar17);
LAB_0017ca1d:
                            iVar18 = (int)local_d0;
                            lVar24 = (long)iVar18;
                            if (*(char *)(lVar24 + 1 + lVar30) == '\0') goto LAB_0017bc33;
                            if (*(char *)(lVar32 + 1 + lVar24) != '\0') goto LAB_0017b917;
                            if (*(char *)(lVar24 + 2 + lVar32) != '\0') {
                              *(undefined4 *)(lVar33 + lVar24 * 4) =
                                   *(undefined4 *)(lVar34 + 8 + lVar24 * 4);
                              local_d0 = local_d0 & 0xffffffff;
                              goto LAB_0017cb8f;
                            }
                            TTA::rtable_[TTA::length_] = TTA::length_;
                            TTA::next_[TTA::length_] = 0xffffffff;
                            TTA::tail_[TTA::length_] = TTA::length_;
                            uVar29 = TTA::length_ + 1;
                            *(uint *)(lVar33 + lVar24 * 4) = TTA::length_;
                            TTA::length_ = uVar29;
                            local_d0 = local_d0 & 0xffffffff;
                            goto LAB_0017c8e4;
                          }
LAB_0017d0bd:
                          uVar15 = (ulong)uVar29;
                          local_d0 = uVar15;
                          if (local_b0 < (int)uVar29) goto LAB_0017d5ac;
                          lVar44 = (long)iVar18;
                          if (*(char *)(lVar30 + uVar15) == '\0') {
                            if (*(char *)(lVar22 + uVar15) == '\0') goto LAB_0017d114;
                            if (*(char *)(lVar30 + 3 + lVar44) != '\0') goto LAB_0017d0d4;
                          }
                          else {
LAB_0017d0d4:
                            if (*(char *)(lVar32 + 3 + lVar44) != '\0') {
                              if (*(char *)(lVar23 + uVar15) != '\0') goto LAB_0017d992;
                              uVar29 = *(uint *)(lVar34 + uVar15 * 4);
                              uVar9 = *(uint *)(lVar33 + lVar44 * 4);
                              goto LAB_0017d9d2;
                            }
                          }
                          uVar29 = *(uint *)(lVar33 + lVar44 * 4);
                          goto LAB_0017e196;
                        }
                        if (local_b0 < (int)local_d0) goto LAB_0017d5ac;
                        uVar15 = local_d0 & 0xffffffff;
                        if (*(char *)(lVar30 + uVar15) == '\0') {
                          if (*(char *)(lVar22 + uVar15) == '\0') goto LAB_0017d114;
                          if (*(char *)(lVar30 + 3 + lVar24) == '\0') goto LAB_0017d9b8;
                        }
                        if (*(char *)(lVar32 + 3 + lVar24) == '\0') goto LAB_0017d9b8;
                        goto LAB_0017c98e;
                      }
LAB_0017b974:
                      *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + lVar24 * 4);
                      goto LAB_0017b980;
                    }
                    goto LAB_0017b8fc;
                  }
                  cVar1 = *(char *)(lVar30 + (local_d0 & 0xffffffff));
                  if (local_b0 < (int)local_d0) {
                    uVar15 = local_d0;
                    if (cVar1 == '\0') goto LAB_0017bd03;
                  }
                  else {
                    if (cVar1 == '\0') goto LAB_0017bd54;
LAB_0017c404:
                    uVar29 = (uint)local_d0;
                    uVar47 = (ulong)(int)uVar29;
                    if (*(char *)(lVar32 + 1 + uVar47) != '\0') {
                      if ((*(char *)(lVar32 + uVar47) != '\0') ||
                         (*(char *)(lVar32 + -1 + uVar47) == '\0')) goto LAB_0017b845;
                      goto LAB_0017e0cc;
                    }
                  }
LAB_0017c428:
                  uVar47 = (ulong)(int)local_d0;
                  if (*(char *)(lVar32 + uVar47) != '\0') goto LAB_0017b845;
                  if (*(char *)(lVar32 + -1 + uVar47) == '\0') goto LAB_0017d80d;
                  uVar16 = *(undefined4 *)(lVar34 + -8 + uVar47 * 4);
                  goto LAB_0017e1a3;
                }
                TTA::rtable_[TTA::length_] = TTA::length_;
                TTA::next_[TTA::length_] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar29 = TTA::length_;
                uVar9 = TTA::length_ + 1;
                *(uint *)(lVar33 + lVar24 * 4) = TTA::length_;
                TTA::length_ = uVar9;
                local_d0 = lVar24 + 2;
                if (local_b0 <= (int)local_d0) {
                  uVar15 = local_d0 & 0xffffffff;
                  if (local_b0 < (int)local_d0) {
                    if (*(char *)(lVar30 + uVar15) == '\0') goto LAB_0017d5b9;
LAB_0017c392:
                    uVar15 = (ulong)(int)local_d0;
                    if (*(char *)(lVar32 + -1 + uVar15) != '\0') {
                      uVar9 = *(uint *)(lVar34 + -8 + uVar15 * 4);
                      goto LAB_0017c492;
                    }
LAB_0017c485:
                    uVar15 = (ulong)(int)local_d0;
                    if (*(char *)(lVar32 + uVar15) == '\0') {
                      uVar29 = *(uint *)(lVar33 + -8 + uVar15 * 4);
                      goto LAB_0017e196;
                    }
                  }
                  else if (*(char *)(lVar30 + uVar15) == '\0') {
                    if (*(char *)(lVar22 + uVar15) == '\0') goto LAB_0017bd70;
                    if (*(char *)(lVar30 + 3 + lVar24) == '\0') {
                      *(uint *)(lVar33 + uVar15 * 4) = uVar29;
                      goto LAB_0017e1a6;
                    }
LAB_0017c47b:
                    uVar15 = (ulong)(int)local_d0;
                    if (*(char *)(lVar32 + 1 + uVar15) == '\0') goto LAB_0017c485;
                  }
                  else {
                    local_d0 = local_d0 & 0xffffffff;
LAB_0017c347:
                    uVar15 = (ulong)(int)local_d0;
                    local_d0 = local_d0 & 0xffffffff;
                    if (*(char *)(lVar32 + 1 + uVar15) == '\0') goto LAB_0017c392;
                    if (*(char *)(lVar32 + uVar15) == '\0') {
                      if (*(char *)(lVar32 + -1 + uVar15) == '\0') {
                        uVar29 = TTA::Merge(*(uint *)(lVar34 + uVar15 * 4),
                                            *(uint *)(lVar33 + -8 + uVar15 * 4));
                        *(uint *)(lVar33 + uVar15 * 4) = uVar29;
                      }
                      else {
                        if (*(char *)(lVar23 + uVar15) == '\0') {
                          uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + uVar15 * 4),
                                              *(uint *)(lVar34 + uVar15 * 4));
                          uVar9 = *(uint *)(lVar33 + -8 + uVar15 * 4);
                        }
                        else {
                          uVar29 = *(uint *)(lVar34 + uVar15 * 4);
                          uVar9 = *(uint *)(lVar33 + -8 + uVar15 * 4);
                        }
                        uVar29 = TTA::Merge(uVar29,uVar9);
                        *(uint *)(lVar33 + uVar15 * 4) = uVar29;
                      }
                      goto LAB_0017e1a6;
                    }
                  }
                  uVar9 = *(uint *)(lVar34 + uVar15 * 4);
                  goto LAB_0017c492;
                }
                if (*(char *)(lVar30 + local_d0) != '\0') {
                  local_d0 = local_d0 & 0xffffffff;
                  goto LAB_0017c29a;
                }
                if (*(char *)(lVar22 + local_d0) != '\0') {
                  if (*(char *)(lVar30 + 3 + lVar24) != '\0') goto LAB_0017c038;
                  *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
                  local_d0 = local_d0 & 0xffffffff;
                  goto LAB_0017c26d;
                }
LAB_0017c0a3:
                local_d0 = local_d0 & 0xffffffff;
              } while( true );
            }
            if (*(char *)(lVar24 + 3 + lVar30) == '\0') goto LAB_0017c1fc;
            if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b90d;
            if (*(char *)(lVar32 + 3 + lVar24) != '\0') {
              if (*(char *)(lVar32 + lVar24) != '\0') goto LAB_0017d952;
              uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4))
              ;
              *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
              goto LAB_0017d566;
            }
            goto LAB_0017da1d;
          }
          if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b802;
          if (*(char *)(lVar24 + 3 + lVar32) != '\0') {
            if (*(char *)(lVar32 + lVar24) == '\0') {
              uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4))
              ;
              *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
            }
            else {
LAB_0017d74a:
              lVar24 = (long)(int)local_d0;
              if (*(char *)(lVar23 + -1 + lVar24) == '\0') {
                uVar29 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),
                                    *(uint *)(lVar33 + -8 + lVar24 * 4));
                *(uint *)(lVar33 + lVar24 * 4) = uVar29;
              }
              else {
LAB_0017d60f:
                lVar24 = (long)(int)local_d0;
                if (*(char *)(lVar32 + lVar24) == '\0') {
                  uVar29 = *(uint *)(lVar34 + lVar24 * 4);
                  if (*(char *)(lVar23 + lVar24) == '\0') {
                    uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
                    *(uint *)(lVar33 + lVar24 * 4) = uVar29;
                  }
                  else {
                    *(uint *)(lVar33 + lVar24 * 4) = uVar29;
                  }
                }
                else {
                  *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + lVar24 * 4);
                }
              }
            }
            goto LAB_0017df04;
          }
          if (*(char *)(lVar30 + 3 + lVar24) == '\0') {
            if (*(char *)(lVar32 + local_d0) == '\0') goto LAB_0017dba0;
            if (*(char *)(lVar32 + lVar24) != '\0') goto LAB_0017db7e;
            uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4));
            *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
            goto LAB_0017c768;
          }
LAB_0017da1d:
          if (*(char *)(lVar24 + 4 + lVar32) != '\0') {
            if (*(char *)(lVar23 + 3 + lVar24) == '\0') {
              if (*(char *)(lVar32 + local_d0) != '\0') {
                if (*(char *)(lVar32 + lVar24) != '\0') goto LAB_0017dcb1;
                uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),
                                    *(uint *)(lVar34 + 0x10 + lVar24 * 4));
                uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + lVar24 * 4));
                local_c8 = local_d0;
                goto LAB_0017dee8;
              }
            }
            else if (*(char *)(lVar32 + lVar24) != '\0') goto LAB_0017da45;
            uVar29 = TTA::Merge(*(uint *)(lVar34 + 0x10 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4)
                               );
            *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
            local_d0 = local_d0 & 0xffffffff;
            goto LAB_0017cb8f;
          }
          if (*(char *)(lVar32 + 2 + lVar24) == '\0') goto LAB_0017dbef;
          if (*(char *)(lVar32 + lVar24) == '\0') {
            uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4));
            *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
          }
          else {
LAB_0017dbca:
            lVar24 = (long)(int)local_d0;
            uVar29 = *(uint *)(lVar34 + lVar24 * 4);
            if (*(char *)(lVar23 + -1 + lVar24) == '\0') {
              uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
              *(uint *)(lVar33 + lVar24 * 4) = uVar29;
            }
            else {
              *(uint *)(lVar33 + lVar24 * 4) = uVar29;
            }
          }
          goto LAB_0017b980;
        }
        uVar15 = local_d0 & 0xffffffff;
        if (local_b0 < (int)local_d0) {
          if (*(char *)(lVar30 + uVar15) == '\0') {
LAB_0017d7f2:
            iVar18 = (int)local_d0;
            uVar47 = local_d0 & 0xffffffff;
            if (*(char *)(lVar22 + uVar47) == '\0') goto LAB_0017e141;
LAB_0017d7ff:
            uVar47 = (ulong)iVar18;
            if (*(char *)(lVar22 + -1 + uVar47) != '\0') goto LAB_0017e19b;
            goto LAB_0017d80d;
          }
          if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b838;
        }
        else {
          if (*(char *)(lVar30 + uVar15) == '\0') {
            if (*(char *)(lVar22 + uVar15) == '\0') goto LAB_0017bd70;
            if (*(char *)(lVar30 + 3 + lVar24) == '\0') {
LAB_0017d9fd:
              iVar18 = (int)local_d0;
              goto LAB_0017d7ff;
            }
          }
          if (*(char *)(lVar22 + 1 + lVar24) == '\0') {
LAB_0017d8ae:
            uVar15 = local_d0 & 0xffffffff;
            goto LAB_0017b7ca;
          }
          if (*(char *)(lVar32 + 3 + lVar24) != '\0') {
            if (*(char *)(lVar32 + lVar24) == '\0') goto LAB_0017c98e;
LAB_0017d87f:
            uVar29 = (uint)local_d0;
            if (*(char *)(lVar23 + -1 + (long)(int)uVar29) != '\0') goto LAB_0017e185;
            uVar15 = local_d0 & 0xffffffff;
            uVar9 = *(uint *)(lVar34 + uVar15 * 4);
            uVar29 = *(uint *)(lVar33 + -8 + (long)(int)uVar29 * 4);
            goto LAB_0017c49b;
          }
        }
        if (*(char *)(lVar32 + uVar15) == '\0') goto LAB_0017d9b8;
LAB_0017d992:
        uVar15 = (ulong)(int)local_d0;
        if (*(char *)((uVar15 - 2) + lVar32) != '\0') goto LAB_0017d9a1;
        uVar29 = *(uint *)(lVar34 + uVar15 * 4);
        goto LAB_0017d9c9;
      }
LAB_0017bacb:
      if (*(char *)(lVar24 + 4 + lVar32) == '\0') {
        *(undefined4 *)(lVar33 + 8 + lVar24 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_0017cf74;
      }
      if ((*(char *)(lVar23 + 3 + lVar24) == '\0') || (*(char *)(lVar23 + local_d0) == '\0')) {
        uVar29 = TTA::Merge(*(uint *)(lVar34 + 0x10 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4));
        *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
        local_d0 = local_d0 & 0xffffffff;
        goto LAB_0017cb8f;
      }
LAB_0017d181:
      lVar24 = (long)(int)local_d0;
      cVar1 = *(char *)(lVar23 + -1 + lVar24);
      uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
      local_d0 = local_d0 & 0xffffffff;
      goto joined_r0x0017d198;
    }
    if (*(char *)(lVar23 + local_d0) == '\0') {
      uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4));
      *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
    }
    else {
LAB_0017b9bf:
      lVar24 = (long)(int)local_d0;
      uVar29 = *(uint *)(lVar34 + lVar24 * 4);
      if (*(char *)(lVar23 + -1 + lVar24) == '\0') {
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      else {
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
    }
    goto LAB_0017df04;
  }
  if (local_b0 < (int)local_d0) {
LAB_0017d5ac:
    uVar47 = (ulong)(int)local_d0;
    if (*(char *)(lVar30 + uVar47) != '\0') goto LAB_0017e19b;
LAB_0017d5b9:
    uVar47 = (ulong)(int)local_d0;
    if (*(char *)(lVar22 + uVar47) == '\0') goto LAB_0017e141;
    goto LAB_0017e19b;
  }
  uVar15 = local_d0 & 0xffffffff;
  if (*(char *)(lVar30 + uVar15) == '\0') {
    if (*(char *)(lVar22 + uVar15) == '\0') {
LAB_0017d114:
      uVar29 = (uint)local_d0;
      uVar47 = (ulong)(int)uVar29;
      if (*(char *)(uVar47 + 1 + lVar30) == '\0') goto LAB_0017bd81;
      cVar1 = *(char *)(lVar32 + 1 + uVar47);
      goto joined_r0x0017d12c;
    }
    if (*(char *)(lVar30 + 3 + lVar24) != '\0') goto LAB_0017b9ff;
  }
  else {
LAB_0017b9ff:
    if (*(char *)(lVar32 + 3 + lVar24) != '\0') {
      if (*(char *)(lVar23 + uVar15) == '\0') {
LAB_0017c98e:
        uVar29 = *(uint *)(lVar34 + uVar15 * 4);
        uVar9 = *(uint *)(lVar33 + lVar24 * 4);
      }
      else {
LAB_0017d9a1:
        uVar15 = (ulong)(int)local_d0;
        uVar29 = *(uint *)(lVar34 + uVar15 * 4);
        if (*(char *)(lVar23 + -1 + uVar15) != '\0') {
          *(uint *)(lVar33 + uVar15 * 4) = uVar29;
          goto LAB_0017e1a6;
        }
LAB_0017d9c9:
        uVar9 = *(uint *)(lVar33 + -8 + uVar15 * 4);
      }
LAB_0017d9d2:
      uVar29 = TTA::Merge(uVar29,uVar9);
      *(uint *)(lVar33 + uVar15 * 4) = uVar29;
      goto LAB_0017e1a6;
    }
  }
LAB_0017d9b8:
  *(undefined4 *)(lVar33 + uVar15 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
  goto LAB_0017e1a6;
LAB_0017d137:
  local_d0 = lVar24 + lVar27;
  if (((*(char *)(lVar23 + 3 + lVar35) == '\0') ||
      (*(char *)(lVar27 + 2 + lVar49 * lVar48 + lVar12 + lVar44) == '\0')) ||
     (*(char *)(lVar32 + lVar35) == '\0')) {
    uVar29 = TTA::Merge(*(uint *)(lVar42 * lVar48 + lVar12 * 4 + lVar26 + 0x10 + lVar27 * 4),
                        *(uint *)(lVar33 + lVar35 * 4));
    *(uint *)(lVar14 + lVar27 * 4) = uVar29;
    local_d0 = local_d0 & 0xffffffff;
LAB_0017cb8f:
    iVar18 = (int)local_d0;
    uVar29 = iVar18 + 2;
    if ((int)uVar29 < local_b0) {
      lVar20 = (long)iVar18;
      lVar14 = lVar20 << 0x20;
      lVar13 = lVar44 + 3 + lVar38 + lVar20;
      lVar12 = lVar49 * lVar37 + lVar20 + lVar44;
      lVar24 = lVar26 + lVar42 * lVar48 + lVar20 * 4;
      lVar27 = lVar24 + 8;
      lVar36 = lVar11 + lVar20 * 4;
      lVar19 = lVar26 + lVar36 + 8;
      lVar25 = 0;
      do {
        lVar35 = lVar14 >> 0x1e;
        iVar45 = (int)(lVar20 + 2);
        iVar17 = (int)lVar25;
        if (*(char *)(lVar13 + -1 + lVar25) == '\0') {
          if (*(char *)(lVar49 * lVar46 + lVar20 + lVar44 + 2 + lVar25) == '\0') {
            local_d0 = lVar20 + 2 + lVar25;
            lVar24 = lVar14 + 0x300000000 >> 0x20;
            if (*(char *)(lVar30 + lVar24) == '\0') {
              iVar18 = (int)local_d0;
              goto LAB_0017bc33;
            }
            if (*(char *)(lVar32 + lVar24) != '\0') {
              *(undefined4 *)(lVar19 + lVar25 * 4) = *(undefined4 *)(lVar27 + lVar25 * 4);
              goto LAB_0017d566;
            }
            if (*(char *)(lVar32 + 4 + (lVar14 >> 0x20)) != '\0') {
              uVar15 = local_d0 & 0xffffffff;
              goto LAB_0017b94a;
            }
            *(undefined4 *)(lVar19 + lVar25 * 4) = *(undefined4 *)(lVar27 + lVar25 * 4);
            goto LAB_0017b980;
          }
          if (*(char *)(lVar13 + lVar25) == '\0') {
            *(undefined4 *)(lVar36 + lVar26 + 8 + lVar25 * 4) = *(undefined4 *)(lVar33 + lVar35);
            local_d0 = (ulong)(uint)(iVar45 + iVar17);
            goto LAB_0017c26d;
          }
          if (*(char *)(lVar12 + 3 + lVar25) != '\0') goto LAB_0017cf03;
        }
        else {
          if (*(char *)(lVar12 + 3 + lVar25) != '\0') {
            local_d0 = (ulong)(uint)(iVar45 + iVar17);
            *(undefined4 *)(lVar19 + lVar25 * 4) = *(undefined4 *)(lVar27 + lVar25 * 4);
            goto LAB_0017df04;
          }
          if (*(char *)(lVar13 + lVar25) == '\0') {
            local_d0 = (ulong)(uint)(iVar45 + iVar17);
            *(undefined4 *)(lVar36 + lVar26 + 8 + lVar25 * 4) = *(undefined4 *)(lVar33 + lVar35);
            goto LAB_0017d70a;
          }
        }
        if (*(char *)(lVar12 + 4 + lVar25) == '\0') {
          *(undefined4 *)(lVar36 + lVar26 + 8 + lVar25 * 4) = *(undefined4 *)(lVar33 + lVar35);
          local_d0 = (ulong)(uint)(iVar45 + iVar17);
          goto LAB_0017cf74;
        }
        uVar29 = *(uint *)(lVar24 + 0x10 + lVar25 * 4);
        if (*(char *)(lVar49 * lVar48 + lVar20 + lVar44 + 3 + lVar25) == '\0') {
          uVar29 = TTA::Merge(uVar29,*(uint *)(lVar26 + lVar36 + lVar25 * 4));
        }
        *(uint *)(lVar19 + lVar25 * 4) = uVar29;
        lVar14 = lVar14 + 0x200000000;
        lVar35 = lVar20 + lVar25;
        lVar25 = lVar25 + 2;
        if (lVar10 <= lVar35 + 4) {
          iVar18 = iVar18 + (int)lVar25;
          uVar29 = iVar45 + (int)lVar25;
          break;
        }
      } while( true );
    }
    uVar47 = (ulong)uVar29;
    local_d0 = uVar47;
    if (local_b0 < (int)uVar29) goto LAB_0017d5ac;
    lVar44 = (long)iVar18;
    if (*(char *)(lVar30 + uVar47) == '\0') {
      cVar1 = *(char *)(lVar30 + 3 + lVar44);
      if (*(char *)(lVar22 + uVar47) == '\0') {
        if (cVar1 == '\0') goto LAB_0017bd81;
        goto LAB_0017b845;
      }
      if (cVar1 == '\0') goto LAB_0017e1fc;
    }
    if (*(char *)(lVar32 + 3 + lVar44) == '\0') goto LAB_0017e1fc;
    goto LAB_0017b845;
  }
  goto LAB_0017d181;
LAB_0017cf03:
  local_d0 = (ulong)(uint)(iVar45 + iVar17);
  *(undefined4 *)(lVar19 + lVar25 * 4) = *(undefined4 *)(lVar27 + lVar25 * 4);
LAB_0017d566:
  lVar24 = (long)(int)local_d0;
  local_d0 = lVar24 + 2;
  uVar29 = (uint)local_d0;
  if (local_b0 <= (int)uVar29) {
    if (local_b0 < (int)uVar29) {
      local_d0 = local_d0 & 0xffffffff;
      goto LAB_0017d5ac;
    }
    uVar15 = local_d0 & 0xffffffff;
    if (*(char *)(lVar30 + uVar15) != '\0') goto LAB_0017e17b;
    if (*(char *)(lVar22 + uVar15) == '\0') goto LAB_0017e3b2;
    if (*(char *)(lVar30 + 3 + lVar24) != '\0') goto LAB_0017e17b;
    *(undefined4 *)(lVar33 + uVar15 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
    goto LAB_0017e1a6;
  }
  if (*(char *)(lVar30 + local_d0) != '\0') goto LAB_0017d5ff;
  if (*(char *)(lVar22 + local_d0) == '\0') goto LAB_0017b8fc;
  uVar15 = local_d0;
  if (*(char *)(lVar30 + 3 + lVar24) != '\0') {
LAB_0017e286:
    local_d0 = uVar15 & 0xffffffff;
    if (*(char *)(lVar32 + 1 + (long)(int)uVar15) != '\0') goto LAB_0017e297;
    goto LAB_0017d63c;
  }
  *(undefined4 *)(lVar33 + 8 + lVar24 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
LAB_0017c26d:
  lVar24 = (long)(int)local_d0;
  local_d0 = lVar24 + 2;
  if (local_b0 <= (int)local_d0) {
    cVar1 = *(char *)(lVar30 + (local_d0 & 0xffffffff));
    if (local_b0 < (int)local_d0) {
      if (cVar1 == '\0') goto LAB_0017d7f2;
      if (*(char *)(lVar22 + 1 + lVar24) != '\0') goto LAB_0017c392;
      goto LAB_0017c428;
    }
    if (cVar1 != '\0') {
      if (*(char *)(lVar22 + 1 + lVar24) != '\0') goto LAB_0017c347;
      goto LAB_0017c404;
    }
LAB_0017c44f:
    iVar18 = (int)local_d0;
    if (*(char *)(lVar22 + (local_d0 & 0xffffffff)) == '\0') goto LAB_0017bd70;
    if (*(char *)(lVar30 + 1 + (long)iVar18) == '\0') goto LAB_0017d7ff;
LAB_0017c46a:
    uVar15 = local_d0 & 0xffffffff;
    if (*(char *)(lVar22 + -1 + (long)(int)local_d0) != '\0') goto LAB_0017c47b;
    goto LAB_0017b7ca;
  }
  if (*(char *)(lVar30 + local_d0) == '\0') {
    local_d0 = local_d0 & 0xffffffff;
LAB_0017c01d:
    lVar24 = (long)(int)local_d0;
    if (*(char *)(lVar22 + lVar24) == '\0') goto LAB_0017c0a3;
    if (*(char *)(lVar30 + 1 + lVar24) != '\0') {
      if (*(char *)(lVar22 + -1 + lVar24) != '\0') goto LAB_0017c038;
      goto LAB_0017b90d;
    }
LAB_0017c1fc:
    lVar24 = (long)(int)local_d0;
    if (*(char *)(lVar22 + -1 + lVar24) == '\0') {
LAB_0017c218:
      TTA::rtable_[TTA::length_] = TTA::length_;
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar29 = TTA::length_ + 1;
      *(uint *)(lVar33 + lVar24 * 4) = TTA::length_;
      TTA::length_ = uVar29;
    }
    else {
      *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar33 + -8 + lVar24 * 4);
    }
    goto LAB_0017c26d;
  }
  if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017bdbe;
LAB_0017c29a:
  lVar24 = (long)(int)local_d0;
  if (*(char *)(lVar24 + 1 + lVar32) != '\0') {
    if ((*(char *)(lVar32 + lVar24) == '\0') && (*(char *)(lVar32 + -1 + lVar24) != '\0')) {
      if (*(char *)(lVar23 + lVar24) == '\0') {
        uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + lVar24 * 4),*(uint *)(lVar34 + lVar24 * 4));
        uVar9 = *(uint *)(lVar33 + -8 + lVar24 * 4);
      }
      else {
        uVar29 = *(uint *)(lVar34 + lVar24 * 4);
        uVar9 = *(uint *)(lVar33 + -8 + lVar24 * 4);
      }
      uVar29 = TTA::Merge(uVar29,uVar9);
      *(uint *)(lVar33 + lVar24 * 4) = uVar29;
    }
    else {
      uVar29 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
      *(uint *)(lVar33 + lVar24 * 4) = uVar29;
    }
    goto LAB_0017df04;
  }
  if (*(char *)(lVar30 + 1 + lVar24) != '\0') {
    if (*(char *)(lVar24 + 2 + lVar32) == '\0') {
      if (*(char *)(lVar32 + -1 + lVar24) == '\0') goto LAB_0017c128;
      uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
      *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      goto LAB_0017cf74;
    }
    if (*(char *)(lVar32 + lVar24) == '\0') {
      if (*(char *)(lVar32 + -1 + lVar24) == '\0') {
        uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
        goto LAB_0017da74;
      }
      if (*(char *)(lVar23 + 1 + lVar24) == '\0') {
        uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + lVar24 * 4),*(uint *)(lVar34 + 8 + lVar24 * 4));
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
        goto LAB_0017cb8f;
      }
      if (*(char *)(lVar23 + lVar24) == '\0') {
        uVar29 = *(uint *)(lVar34 + -8 + lVar24 * 4);
        goto LAB_0017c6ac;
      }
LAB_0017c3f1:
      uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
      uVar9 = *(uint *)(lVar33 + -8 + lVar24 * 4);
    }
    else {
      if (*(char *)(lVar23 + 1 + lVar24) != '\0') goto LAB_0017c3f1;
      uVar29 = *(uint *)(lVar34 + lVar24 * 4);
LAB_0017c6ac:
      uVar29 = TTA::Merge(uVar29,*(uint *)(lVar34 + 8 + lVar24 * 4));
      uVar9 = *(uint *)(lVar33 + -8 + lVar24 * 4);
    }
    uVar29 = TTA::Merge(uVar29,uVar9);
    *(uint *)(lVar33 + lVar24 * 4) = uVar29;
    goto LAB_0017cb8f;
  }
  if (*(char *)(lVar32 + -1 + lVar24) != '\0') {
    uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
    *(uint *)(lVar33 + lVar24 * 4) = uVar29;
    goto LAB_0017d70a;
  }
  local_d0 = local_d0 & 0xffffffff;
LAB_0017c61e:
  iVar18 = (int)local_d0;
  lVar24 = (long)iVar18;
  if (*(char *)(lVar32 + lVar24) == '\0') {
    *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar33 + -8 + lVar24 * 4);
  }
  else {
    uVar29 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
    *(uint *)(lVar33 + lVar24 * 4) = uVar29;
LAB_0017c768:
    lVar24 = (long)(int)local_d0;
    local_d0 = lVar24 + 2;
    if (local_b0 <= (int)local_d0) {
      uVar15 = local_d0 & 0xffffffff;
      if (local_b0 < (int)local_d0) {
        if (*(char *)(lVar30 + uVar15) == '\0') goto LAB_0017d7f2;
        if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b838;
      }
      else {
        if (*(char *)(lVar30 + uVar15) == '\0') {
          if (*(char *)(lVar22 + uVar15) == '\0') goto LAB_0017bd70;
          if (*(char *)(lVar30 + 3 + lVar24) == '\0') goto LAB_0017d9fd;
        }
        if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017d8ae;
        if (*(char *)(lVar32 + 3 + lVar24) != '\0') goto LAB_0017d87f;
      }
      if (*(char *)(lVar32 + uVar15) != '\0') goto LAB_0017d9a1;
      *(undefined4 *)(lVar33 + uVar15 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
      goto LAB_0017e1a6;
    }
    if (*(char *)(lVar30 + local_d0) == '\0') {
      if (*(char *)(lVar22 + local_d0) == '\0') goto LAB_0017d975;
      if (*(char *)(lVar24 + 3 + lVar30) == '\0') goto LAB_0017c1fc;
      if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b90d;
      if (*(char *)(lVar32 + 3 + lVar24) != '\0') goto LAB_0017d952;
LAB_0017c845:
      if (*(char *)(lVar24 + 4 + lVar32) == '\0') {
        if (*(char *)(lVar32 + local_d0) == '\0') goto LAB_0017dbef;
        goto LAB_0017dbca;
      }
      if (*(char *)(lVar23 + 3 + lVar24) != '\0') goto LAB_0017da45;
      if (*(char *)(lVar32 + local_d0) == '\0') {
        uVar29 = TTA::Merge(*(uint *)(lVar34 + 0x10 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4));
        local_c8 = local_d0;
LAB_0017dee8:
        *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
        local_d0 = local_c8 & 0xffffffff;
      }
      else {
LAB_0017dcb1:
        lVar24 = (long)(int)local_d0;
        if (*(char *)(lVar23 + -1 + lVar24) == '\0') {
          uVar29 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),*(uint *)(lVar34 + 8 + lVar24 * 4));
          uVar9 = *(uint *)(lVar33 + -8 + lVar24 * 4);
        }
        else {
          uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
          uVar9 = *(uint *)(lVar33 + -8 + lVar24 * 4);
        }
        uVar29 = TTA::Merge(uVar29,uVar9);
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      goto LAB_0017cb8f;
    }
    if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b802;
    if (*(char *)(lVar24 + 3 + lVar32) != '\0') goto LAB_0017d74a;
    if (*(char *)(lVar30 + 3 + lVar24) != '\0') goto LAB_0017c845;
    if (*(char *)(lVar32 + local_d0) != '\0') {
LAB_0017db7e:
      lVar24 = (long)(int)local_d0;
      uVar29 = *(uint *)(lVar34 + lVar24 * 4);
      if (*(char *)(lVar23 + -1 + lVar24) == '\0') {
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      else {
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      goto LAB_0017c768;
    }
LAB_0017dba0:
    iVar18 = (int)local_d0;
    *(undefined4 *)(lVar33 + 8 + lVar24 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
  }
LAB_0017bf47:
  lVar24 = (long)iVar18;
  local_d0 = lVar24 + 2;
  if (local_b0 <= (int)local_d0) {
    cVar1 = *(char *)(lVar30 + (local_d0 & 0xffffffff));
    if ((int)local_d0 <= local_b0) {
      if (cVar1 == '\0') goto LAB_0017c44f;
      goto LAB_0017c46a;
    }
    if (cVar1 == '\0') goto LAB_0017d7f2;
    if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b838;
    goto LAB_0017c485;
  }
  if (*(char *)(lVar30 + local_d0) == '\0') goto LAB_0017c01d;
  if (*(char *)(lVar22 + 1 + lVar24) == '\0') goto LAB_0017b802;
  if (*(char *)(lVar24 + 3 + lVar32) != '\0') {
    uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + lVar24 * 4));
    *(uint *)(lVar33 + 8 + lVar24 * 4) = uVar29;
    goto LAB_0017df04;
  }
  if (*(char *)(lVar30 + 3 + lVar24) != '\0') goto LAB_0017c0b0;
  goto LAB_0017c61e;
LAB_0017d5ff:
  lVar24 = (long)(int)local_d0;
  if (*(char *)(lVar24 + 1 + lVar32) != '\0') {
    local_d0 = local_d0 & 0xffffffff;
    goto LAB_0017d60f;
  }
  uVar15 = local_d0;
  if (*(char *)(lVar30 + 1 + lVar24) == '\0') {
    *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar33 + -8 + lVar24 * 4);
    goto LAB_0017d70a;
  }
LAB_0017d63c:
  local_d0 = uVar15;
  lVar24 = (long)(int)local_d0;
  if (*(char *)(lVar32 + 2 + lVar24) == '\0') {
    *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar33 + -8 + lVar24 * 4);
    goto LAB_0017cf74;
  }
LAB_0017d64f:
  lVar24 = (long)(int)local_d0;
  cVar1 = *(char *)(lVar23 + 1 + lVar24);
joined_r0x0017d65c:
  if (cVar1 == '\0') {
    uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
LAB_0017da74:
    uVar9 = *(uint *)(lVar33 + -8 + lVar24 * 4);
    uVar15 = local_d0;
LAB_0017da7c:
    uVar29 = TTA::Merge(uVar29,uVar9);
    local_d0 = uVar15;
  }
  else {
    lVar24 = (long)(int)local_d0;
    if (*(char *)(lVar32 + lVar24) == '\0') {
      cVar1 = *(char *)(lVar23 + lVar24);
      uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
joined_r0x0017d198:
      if (cVar1 == '\0') {
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      else {
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      goto LAB_0017cb8f;
    }
LAB_0017b95d:
    uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
  }
  *(uint *)(lVar33 + lVar24 * 4) = uVar29;
  goto LAB_0017cb8f;
LAB_0017bdbe:
  iVar18 = (int)local_d0;
  lVar24 = (long)iVar18;
  if (*(char *)(lVar24 + 1 + lVar32) != '\0') {
    if ((*(char *)(lVar32 + lVar24) == '\0') && (*(char *)(lVar32 + -1 + lVar24) != '\0'))
    goto LAB_0017e347;
    *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + lVar24 * 4);
    goto LAB_0017df04;
  }
  if (*(char *)(lVar30 + 1 + lVar24) == '\0') {
    if (*(char *)(lVar32 + lVar24) != '\0') {
      *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + lVar24 * 4);
      goto LAB_0017c768;
    }
    if (*(char *)(lVar32 + -1 + lVar24) == '\0') {
      TTA::rtable_[TTA::length_] = TTA::length_;
      TTA::next_[TTA::length_] = 0xffffffff;
      TTA::tail_[TTA::length_] = TTA::length_;
      uVar29 = TTA::length_ + 1;
      *(uint *)(lVar33 + lVar24 * 4) = TTA::length_;
      TTA::length_ = uVar29;
      goto LAB_0017bf47;
    }
    *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + -8 + lVar24 * 4);
    goto LAB_0017bf47;
  }
  if (*(char *)(lVar32 + 2 + lVar24) == '\0') {
    if (*(char *)(lVar32 + lVar24) != '\0') goto LAB_0017b974;
    if (*(char *)(lVar32 + -1 + lVar24) == '\0') goto LAB_0017be7f;
    *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + -8 + lVar24 * 4);
    goto LAB_0017c8e4;
  }
  uVar15 = local_d0;
  if (*(char *)(lVar32 + lVar24) == '\0') {
    if (*(char *)(lVar32 + -1 + lVar24) == '\0') {
LAB_0017be19:
      *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar34 + 8 + lVar24 * 4);
    }
    else {
LAB_0017e599:
      lVar24 = (long)(int)local_d0;
      if ((*(char *)(lVar23 + 1 + lVar24) == '\0') || (*(char *)(lVar23 + lVar24) == '\0')) {
        uVar29 = TTA::Merge(*(uint *)(lVar34 + -8 + lVar24 * 4),*(uint *)(lVar34 + 8 + lVar24 * 4));
      }
      else {
        uVar29 = *(uint *)(lVar34 + 8 + lVar24 * 4);
      }
      *(uint *)(lVar33 + lVar24 * 4) = uVar29;
    }
    goto LAB_0017cb8f;
  }
LAB_0017b94a:
  lVar24 = (long)(int)uVar15;
  local_d0 = uVar15;
  if (*(char *)(lVar23 + 1 + lVar24) == '\0') {
    uVar29 = *(uint *)(lVar34 + lVar24 * 4);
    uVar9 = *(uint *)(lVar34 + 8 + lVar24 * 4);
    goto LAB_0017da7c;
  }
  goto LAB_0017b95d;
LAB_0017d952:
  lVar24 = (long)(int)local_d0;
  if (*(char *)(lVar23 + -1 + lVar24) == '\0') {
    uVar29 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
  }
  else {
LAB_0017e297:
    lVar24 = (long)(int)local_d0;
    if (*(char *)(lVar32 + lVar24) == '\0') {
      uVar29 = *(uint *)(lVar34 + lVar24 * 4);
      if (*(char *)(lVar23 + lVar24) == '\0') {
        uVar29 = TTA::Merge(uVar29,*(uint *)(lVar33 + -8 + lVar24 * 4));
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      else {
        *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      }
      goto LAB_0017d566;
    }
    uVar29 = *(uint *)(lVar34 + lVar24 * 4);
  }
  *(uint *)(lVar33 + lVar24 * 4) = uVar29;
  goto LAB_0017d566;
LAB_0017dbef:
  *(undefined4 *)(lVar33 + 8 + lVar24 * 4) = *(undefined4 *)(lVar33 + lVar24 * 4);
  local_d0 = local_d0 & 0xffffffff;
  goto LAB_0017c8e4;
LAB_0017da45:
  iVar18 = (int)local_d0;
  local_d0 = local_d0 & 0xffffffff;
  lVar24 = (long)iVar18;
  cVar1 = *(char *)(lVar23 + -1 + lVar24);
  goto joined_r0x0017d65c;
LAB_0017c038:
  lVar24 = (long)(int)local_d0;
  if (*(char *)(lVar32 + 1 + lVar24) == '\0') goto LAB_0017c0b0;
  uVar29 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
  *(uint *)(lVar33 + lVar24 * 4) = uVar29;
  goto LAB_0017d566;
LAB_0017c0b0:
  lVar24 = (long)(int)local_d0;
  if (*(char *)(lVar24 + 2 + lVar32) != '\0') {
    if (*(char *)(lVar23 + 1 + lVar24) == '\0') {
      if (*(char *)(lVar32 + lVar24) == '\0') {
        uVar9 = *(uint *)(lVar34 + 8 + lVar24 * 4);
        uVar29 = *(uint *)(lVar33 + -8 + lVar24 * 4);
      }
      else {
        uVar9 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),*(uint *)(lVar34 + 8 + lVar24 * 4));
        uVar29 = *(uint *)(lVar33 + -8 + lVar24 * 4);
      }
      uVar29 = TTA::Merge(uVar9,uVar29);
      *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      local_d0 = local_d0 & 0xffffffff;
    }
    else {
      uVar29 = TTA::Merge(*(uint *)(lVar34 + 8 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
      *(uint *)(lVar33 + lVar24 * 4) = uVar29;
      local_d0 = local_d0 & 0xffffffff;
    }
    goto LAB_0017cb8f;
  }
  local_d0 = local_d0 & 0xffffffff;
LAB_0017c128:
  lVar24 = (long)(int)local_d0;
  if (*(char *)(lVar32 + lVar24) != '\0') {
    uVar29 = TTA::Merge(*(uint *)(lVar34 + lVar24 * 4),*(uint *)(lVar33 + -8 + lVar24 * 4));
    *(uint *)(lVar33 + lVar24 * 4) = uVar29;
    goto LAB_0017b980;
  }
  *(undefined4 *)(lVar33 + lVar24 * 4) = *(undefined4 *)(lVar33 + -8 + lVar24 * 4);
  goto LAB_0017c8e4;
code_r0x0017ed95:
  if (*(char *)(lVar30 + lVar36) == '\0') {
    uVar15 = (ulong)(iVar18 + iVar45 + 2);
    *(undefined4 *)(lVar48 + lVar36 * 4) = *(undefined4 *)(lVar31 + (lVar24 >> 0x1e));
    goto LAB_0017ef13;
  }
  uVar39 = *(uint *)(lVar22 + lVar36 * 4);
  if (*(char *)(lVar26 + lVar23 + lVar36) == '\0') {
    uVar39 = TTA::Merge(uVar39,*(uint *)(lVar48 + -8 + lVar36 * 4));
  }
  *(uint *)(lVar48 + lVar36 * 4) = uVar39;
  lVar24 = lVar24 + 0x200000000;
  lVar13 = lVar23 + lVar36;
  lVar36 = lVar36 + 2;
  if (lVar34 <= lVar13 + 4) {
    uVar39 = iVar18 + (int)lVar36 + 2;
    iVar18 = iVar18 + (int)lVar36;
    goto LAB_0017f4d9;
  }
  goto LAB_0017ed71;
code_r0x0017f197:
  *(undefined4 *)(lVar23 + lVar24 * 4) = *(undefined4 *)(lVar30 + -8 + lVar24 * 4);
  lVar13 = lVar48 + lVar24;
  lVar24 = lVar24 + 2;
  if (lVar34 <= lVar13 + 2) {
    uVar39 = iVar18 + (int)lVar24 + 2;
    iVar18 = iVar18 + (int)lVar24;
    goto LAB_0017f486;
  }
  goto LAB_0017f172;
LAB_0017ecd0:
  *(undefined4 *)(lVar31 + uVar15 * 4) = *(undefined4 *)(lVar44 + 8 + uVar15 * 4);
  uVar15 = uVar47;
  goto LAB_0017ed1f;
LAB_0017ea33:
  uVar39 = *(uint *)(lVar44 + lVar48 * 4);
  uVar28 = *(uint *)(lVar44 + 8 + lVar48 * 4);
  goto LAB_0017ea3d;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}